

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cpp
# Opt level: O1

MaybeResult<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
* wasm::WATParser::anon_unknown_21::assertion
            (MaybeResult<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
             *__return_storage_ptr__,Lexer *in)

{
  _Variant_storage<false,_std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_wasm::Err>
  *this;
  variant<wasm::Literal,_wasm::WATParser::NaNResult> *pvVar1;
  _Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
  *this_00;
  _Storage<double,_true> _Var2;
  vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>
  *this_01;
  undefined1 *puVar3;
  pointer *ppvVar4;
  size_t pos;
  _Copy_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult> *p_Var5;
  undefined1 uVar6;
  __index_type _Var7;
  bool bVar8;
  optional<float> oVar9;
  Literal *other;
  _Variant_storage<false,_std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_wasm::Err>
  *__args;
  undefined8 uVar10;
  _Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction> *__rhs;
  _Copy_ctor_base<false,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>,_wasm::Err>
  *__x;
  Result<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_> *pRVar11;
  MaybeResult<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_> *__rhs_00;
  _Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
  *__rhs_01;
  pointer *ppvVar12;
  _Alloc_hider _Var13;
  undefined1 auVar14 [8];
  undefined4 uVar15;
  int iVar16;
  string_view expected;
  string_view expected_00;
  string_view expected_01;
  string_view expected_02;
  string_view expected_03;
  string_view expected_04;
  string_view expected_05;
  string_view expected_06;
  string_view expected_07;
  string_view expected_08;
  string_view expected_09;
  string_view expected_10;
  string_view expected_11;
  string_view expected_12;
  string_view expected_13;
  string_view expected_14;
  string_view expected_15;
  string_view expected_16;
  string_view expected_17;
  optional<double> oVar17;
  string local_4c8;
  string local_4a8;
  string local_488;
  string local_468;
  undefined1 local_448 [16];
  variant<wasm::Literal,_wasm::WATParser::NaNResult> local_438;
  undefined1 auStack_418 [8];
  ExpectedResults res;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  undefined1 auStack_2e8 [8];
  LaneResults lanes;
  Result<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_> a_2;
  char local_250;
  char local_248;
  undefined1 local_240 [8];
  Result<wasm::Literal> c;
  pointer *local_1d0 [2];
  pointer local_1c0;
  ulong uStack_1b8;
  undefined1 local_1b0 [8];
  Result<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_> a;
  Result<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_> _val;
  char local_c0;
  char local_b8;
  undefined1 local_b0 [8];
  Result<wasm::WATParser::NaNKind> _val_1;
  undefined1 local_80 [8];
  Result<wasm::WATParser::NaNKind> kind;
  pointer local_48;
  ulong uStack_40;
  char local_38;
  
  expected._M_str = "assert_return";
  expected._M_len = 0xd;
  _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ = __return_storage_ptr__;
  bVar8 = Lexer::takeSExprStart(in,expected);
  if (bVar8) {
    action((Result<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_> *)
           local_1b0,in);
    std::__detail::__variant::
    _Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       *)((long)&a.val.
                                 super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                 .
                                 super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                 .
                                 super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                 .
                                 super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                 .
                                 super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         + 0x68),
                      (_Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       *)local_1b0);
    if (_val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._M_first._M_storage._M_storage[0x60] == '\x01') {
      pvVar1 = (variant<wasm::Literal,_wasm::WATParser::NaNResult> *)
               ((long)&c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                       super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 8);
      local_240 = (undefined1  [8])pvVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_240,
                 a.val.
                 super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 .
                 super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 .
                 super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 .
                 super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 .
                 super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 .
                 super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 ._104_8_,_val.val.
                          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          ._M_u._0_8_ +
                          a.val.
                          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          ._104_8_);
      lanes.
      super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)&a_2.val.
                            super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                            .
                            super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                            .
                            super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                            .
                            super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                            .
                            super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    + 8);
      if (local_240 == (undefined1  [8])pvVar1) {
        a_2.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._16_8_ = c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                       super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._16_8_;
      }
      else {
        lanes.
        super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_240;
      }
      a_2.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_u._8_8_ = c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                    super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._8_8_;
      a_2.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_u._0_8_ = c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                    super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._0_8_;
      local_250 = '\x02';
      std::__detail::__variant::
      _Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           *)((long)&a.val.
                                     super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                     .
                                     super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                     .
                                     super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                     .
                                     super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                     .
                                     super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             + 0x68));
    }
    else {
      this_00 = (_Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 *)((long)&a.val.
                           super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           .
                           super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           .
                           super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           .
                           super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           .
                           super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   + 0x68);
      std::__detail::__variant::
      _Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ::~_Variant_storage(this_00);
      auStack_418 = (undefined1  [8])0x0;
      res.
      super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      res.
      super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      while (bVar8 = Lexer::peekRParen(in), !bVar8) {
        a.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._104_8_ = in->pos;
        std::vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>::
        vector((vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> *)
               &_val,&in->annotations);
        _val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._M_first._M_storage._M_storage[0x38] = '\0';
        bVar8 = (in->file).
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_engaged == true;
        if (bVar8) {
          _val.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_u._24_8_ = (long)&_val.val.
                                super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                .
                                super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                .
                                super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                .
                                super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                .
                                super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         + 0x28;
          _Var13._M_p = (in->file).
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload._M_value._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)
                     ((long)&_val.val.
                             super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             .
                             super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             .
                             super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             .
                             super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             .
                             super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     + 0x18),_Var13._M_p,
                     _Var13._M_p +
                     (in->file).
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_payload._M_value._M_string_length);
        }
        _val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._64_8_ = (in->buffer)._M_len;
        _val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._72_8_ = (in->buffer)._M_str;
        _val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._M_first._M_storage._M_storage[0x38] = bVar8;
        const_((Result<wasm::Literal> *)local_240,(Lexer *)this_00);
        if (c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
            super__Move_assign_alias<wasm::Literal,_wasm::Err>.
            super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
            super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
            super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._24_1_ != '\x01') {
          in->pos = a.val.
                    super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    ._104_8_;
          std::vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>::
          operator=(&in->annotations,
                    (vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                     *)&_val);
          std::
          _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_M_copy_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&in->file,
                           (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)((long)&_val.val.
                                      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                      .
                                      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                      .
                                      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                      .
                                      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                      .
                                      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              + 0x18));
          (in->buffer)._M_len =
               _val.val.
               super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               .
               super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               .
               super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               .
               super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               .
               super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               .
               super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               ._M_u._64_8_;
          (in->buffer)._M_str =
               (char *)_val.val.
                       super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       ._M_u._72_8_;
          other = (Literal *)0x0;
          if (c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
              super__Move_assign_alias<wasm::Literal,_wasm::Err>.
              super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
              super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
              super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._24_1_ == '\0') {
            other = (Literal *)local_240;
          }
          Literal::Literal((Literal *)
                           ((long)&kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>
                                   .super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> +
                           0x20),other);
          uStack_40 = uStack_40 & 0xffffffffffffff00;
          local_38 = '\0';
          goto LAB_00c2ef85;
        }
        expected_00._M_str = "f32.const";
        expected_00._M_len = 9;
        bVar8 = Lexer::takeSExprStart(in,expected_00);
        if (bVar8) {
          nan((anon_unknown_21 *)local_80,(char *)in);
          std::__detail::__variant::_Copy_ctor_base<false,_wasm::WATParser::NaNKind,_wasm::Err>::
          _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::NaNKind,_wasm::Err> *)local_b0,
                          (_Copy_ctor_base<false,_wasm::WATParser::NaNKind,_wasm::Err> *)local_80);
          if (_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._24_1_ ==
              '\x01') {
            local_1d0[0] = &local_1c0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_1d0,local_b0,
                       (undefined1 *)
                       (_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._0_8_
                       + (long)local_b0));
LAB_00c2e804:
            kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ = &local_48;
            if (local_1d0[0] == &local_1c0) {
              uStack_40 = uStack_1b8;
            }
            else {
              kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ =
                   local_1d0[0];
            }
            local_48 = local_1c0;
            local_38 = '\x01';
            std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err> *)
                              local_b0);
          }
          else {
            std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err> *)
                              local_b0);
            bVar8 = Lexer::takeRParen(in);
            if (bVar8) {
              kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_4_ =
                   local_80._0_4_;
LAB_00c2e9f4:
              uStack_40 = CONCAT71(uStack_40._1_7_,2);
              local_38 = '\0';
            }
            else {
              local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
              local_1d0[0] = (pointer *)&DAT_00000019;
              local_3e8._M_dataplus._M_p =
                   (pointer)std::__cxx11::string::_M_create((ulong *)&local_3e8,(ulong)local_1d0);
              local_3e8.field_2._M_allocated_capacity = (size_type)local_1d0[0];
              builtin_strncpy(local_3e8._M_dataplus._M_p,"expected end of f32.const",0x19);
              local_3e8._M_string_length = (size_type)local_1d0[0];
              local_3e8._M_dataplus._M_p[(long)local_1d0[0]] = '\0';
              Lexer::err((Err *)local_b0,in,&local_3e8);
              kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ = &local_48;
              _Var2 = (_Storage<double,_true>)
                      ((long)&_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                              super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                              super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                              super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 8);
              if ((_Storage<double,_true>)local_b0 == _Var2) {
                uStack_40 = CONCAT71(_val_1.val.
                                     super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                     ._M_u._17_7_,
                                     _val_1.val.
                                     super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                     ._M_u._16_1_);
              }
              else {
                kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ = local_b0;
              }
              local_48 = (pointer)_val_1.val.
                                  super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  _M_u._8_8_;
              _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._0_8_ = 0;
              _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_ =
                   _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_ &
                   0xffffffffffffff00;
              local_38 = '\x01';
              uVar10 = local_3e8.field_2._M_allocated_capacity;
              _Var13._M_p = local_3e8._M_dataplus._M_p;
              local_b0 = (undefined1  [8])_Var2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
LAB_00c2ef75:
                local_b0 = (undefined1  [8])
                           ((long)&_val_1.val.
                                   super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                   super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 8);
                local_38 = '\x01';
                _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._0_8_ = 0;
                operator_delete(_Var13._M_p,(ulong)(uVar10 + 1));
              }
            }
          }
LAB_00c2ef7d:
          std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err> *)local_80
                           );
        }
        else {
          expected_01._M_str = "f64.const";
          expected_01._M_len = 9;
          bVar8 = Lexer::takeSExprStart(in,expected_01);
          if (bVar8) {
            nan((anon_unknown_21 *)local_80,(char *)in);
            std::__detail::__variant::_Copy_ctor_base<false,_wasm::WATParser::NaNKind,_wasm::Err>::
            _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::NaNKind,_wasm::Err> *)local_b0,
                            (_Copy_ctor_base<false,_wasm::WATParser::NaNKind,_wasm::Err> *)local_80)
            ;
            if (_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._24_1_ ==
                '\x01') {
              local_1d0[0] = &local_1c0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_1d0,local_b0,
                         (undefined1 *)
                         (_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u.
                          _0_8_ + (long)local_b0));
              goto LAB_00c2e804;
            }
            std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err> *)
                              local_b0);
            bVar8 = Lexer::takeRParen(in);
            if (bVar8) {
              kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_4_ =
                   local_80._0_4_;
              goto LAB_00c2e9f4;
            }
            local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
            local_1d0[0] = (pointer *)&DAT_00000019;
            local_3c8._M_dataplus._M_p =
                 (pointer)std::__cxx11::string::_M_create((ulong *)&local_3c8,(ulong)local_1d0);
            local_3c8.field_2._M_allocated_capacity = (size_type)local_1d0[0];
            builtin_strncpy(local_3c8._M_dataplus._M_p,"expected end of f64.const",0x19);
            local_3c8._M_string_length = (size_type)local_1d0[0];
            local_3c8._M_dataplus._M_p[(long)local_1d0[0]] = '\0';
            Lexer::err((Err *)local_b0,in,&local_3c8);
            kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ = &local_48;
            _Var2 = (_Storage<double,_true>)
                    ((long)&_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 8);
            if ((_Storage<double,_true>)local_b0 == _Var2) {
              uStack_40 = CONCAT71(_val_1.val.
                                   super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                   super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                   super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                   ._M_u._17_7_,
                                   _val_1.val.
                                   super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                   super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                   super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                   ._M_u._16_1_);
            }
            else {
              kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ = local_b0;
            }
            local_48 = (pointer)_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                _M_u._8_8_;
            _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._0_8_ = 0;
            _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_ =
                 _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                 super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                 super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                 super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                 super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_ &
                 0xffffffffffffff00;
            local_38 = '\x01';
            uVar10 = local_3c8.field_2._M_allocated_capacity;
            _Var13._M_p = local_3c8._M_dataplus._M_p;
            local_b0 = (undefined1  [8])_Var2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) goto LAB_00c2ef75;
            goto LAB_00c2ef7d;
          }
          expected_02._M_str = "v128.const";
          expected_02._M_len = 10;
          bVar8 = Lexer::takeSExprStart(in,expected_02);
          if (bVar8) {
            auStack_2e8 = (undefined1  [8])0x0;
            lanes.
            super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            lanes.
            super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            expected_03._M_str = "f32x4";
            expected_03._M_len = 5;
            bVar8 = Lexer::takeKeyword(in,expected_03);
            if (bVar8) {
              iVar16 = 4;
              do {
                oVar9 = Lexer::takeF32(in);
                if (((ulong)oVar9.super__Optional_base<float,_true,_true>._M_payload.
                            super__Optional_payload_base<float> >> 0x20 & 1) == 0) {
                  nan((anon_unknown_21 *)local_80,(char *)in);
                  std::__detail::__variant::
                  _Copy_ctor_base<false,_wasm::WATParser::NaNKind,_wasm::Err>::_Copy_ctor_base
                            ((_Copy_ctor_base<false,_wasm::WATParser::NaNKind,_wasm::Err> *)local_b0
                             ,(_Copy_ctor_base<false,_wasm::WATParser::NaNKind,_wasm::Err> *)
                              local_80);
                  if (_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._24_1_
                      != '\x01') {
                    std::__detail::__variant::
                    _Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err>::~_Variant_storage
                              ((_Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err> *)
                               local_b0);
                    local_b0._0_4_ = local_80._0_4_;
                    _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._0_8_ = 4
                    ;
                    _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._16_1_ =
                         1;
                    std::
                    vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>
                    ::emplace_back<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>
                              ((vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>
                                *)auStack_2e8,
                               (variant<wasm::Literal,_wasm::WATParser::NaNResult> *)local_b0);
                    std::__detail::__variant::
                    _Variant_storage<false,_wasm::Literal,_wasm::WATParser::NaNResult>::
                    ~_Variant_storage((_Variant_storage<false,_wasm::Literal,_wasm::WATParser::NaNResult>
                                       *)local_b0);
                    std::__detail::__variant::
                    _Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err>::~_Variant_storage
                              ((_Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err> *)
                               local_80);
                    goto LAB_00c2e938;
                  }
                  local_1d0[0] = &local_1c0;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_1d0,local_b0,
                             (undefined1 *)
                             (_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                              super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                              super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                              super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                              super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u
                              ._0_8_ + (long)local_b0));
LAB_00c2f232:
                  kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ =
                       &local_48;
                  if (local_1d0[0] == &local_1c0) {
                    uStack_40 = uStack_1b8;
                  }
                  else {
                    kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ =
                         local_1d0[0];
                  }
                  local_48 = local_1c0;
                  local_38 = '\x01';
                  std::__detail::__variant::
                  _Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err>::~_Variant_storage
                            ((_Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err> *)
                             local_b0);
                  std::__detail::__variant::
                  _Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err>::~_Variant_storage
                            ((_Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err> *)
                             local_80);
                  goto LAB_00c2f285;
                }
                local_b0._0_4_ =
                     oVar9.super__Optional_base<float,_true,_true>._M_payload.
                     super__Optional_payload_base<float>._M_payload;
                _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_ = 4;
                Literal::Literal((Literal *)local_80,(Literal *)local_b0);
                kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._16_1_ = 0;
                std::
                vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>
                ::emplace_back<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>
                          ((vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>
                            *)auStack_2e8,
                           (variant<wasm::Literal,_wasm::WATParser::NaNResult> *)local_80);
                std::__detail::__variant::
                _Variant_storage<false,_wasm::Literal,_wasm::WATParser::NaNResult>::
                ~_Variant_storage((_Variant_storage<false,_wasm::Literal,_wasm::WATParser::NaNResult>
                                   *)local_80);
                Literal::~Literal((Literal *)local_b0);
LAB_00c2e938:
                iVar16 = iVar16 + -1;
              } while (iVar16 != 0);
LAB_00c2eb8e:
              bVar8 = Lexer::takeRParen(in);
              if (bVar8) {
                kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ =
                     auStack_2e8;
                local_48 = lanes.
                           super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                auStack_2e8 = (undefined1  [8])0x0;
                lanes.
                super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                lanes.
                super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                uStack_40 = CONCAT71(uStack_40._1_7_,3);
                local_38 = '\0';
              }
              else {
                local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
                local_b0 = (undefined1  [8])0x1a;
                local_388._M_dataplus._M_p =
                     (pointer)std::__cxx11::string::_M_create((ulong *)&local_388,(ulong)local_b0);
                local_388.field_2._M_allocated_capacity = (size_type)local_b0;
                builtin_strncpy(local_388._M_dataplus._M_p,"expected end of v128.const",0x1a);
                local_388._M_string_length = (size_type)local_b0;
                local_388._M_dataplus._M_p[(long)local_b0] = '\0';
                Lexer::err((Err *)local_80,in,&local_388);
                kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ = &local_48
                ;
                pvVar1 = (variant<wasm::Literal,_wasm::WATParser::NaNResult> *)
                         ((long)&kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                 super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 8);
                if (local_80 == (undefined1  [8])pvVar1) {
                  uStack_40 = CONCAT71(kind.val.
                                       super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       .
                                       super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       .super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       ._M_u._17_7_,
                                       kind.val.
                                       super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       .
                                       super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       .super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       ._M_u._16_1_);
                }
                else {
                  kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ =
                       local_80;
                }
                local_48 = (pointer)kind.val.
                                    super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                    super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                    super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                    ._M_u._8_8_;
                kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._0_8_ = 0;
                kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_ =
                     kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_ &
                     0xffffffffffffff00;
                local_38 = '\x01';
                uVar10 = local_388.field_2._M_allocated_capacity;
                _Var13._M_p = local_388._M_dataplus._M_p;
                local_80 = (undefined1  [8])pvVar1;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_388._M_dataplus._M_p != &local_388.field_2) {
LAB_00c2f1fd:
                  local_80 = (undefined1  [8])
                             ((long)&kind.val.
                                     super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 8
                             );
                  local_38 = '\x01';
                  kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._0_8_ = 0;
                  operator_delete(_Var13._M_p,(ulong)(uVar10 + 1));
                }
              }
            }
            else {
              expected_05._M_str = "f64x2";
              expected_05._M_len = 5;
              bVar8 = Lexer::takeKeyword(in,expected_05);
              if (bVar8) {
                iVar16 = 1;
                do {
                  oVar17 = Lexer::takeF64(in);
                  if (((undefined1  [16])
                       oVar17.super__Optional_base<double,_true,_true>._M_payload.
                       super__Optional_payload_base<double> & (undefined1  [16])0x1) ==
                      (undefined1  [16])0x0) {
                    nan((anon_unknown_21 *)local_80,(char *)in);
                    std::__detail::__variant::
                    _Copy_ctor_base<false,_wasm::WATParser::NaNKind,_wasm::Err>::_Copy_ctor_base
                              ((_Copy_ctor_base<false,_wasm::WATParser::NaNKind,_wasm::Err> *)
                               local_b0,(_Copy_ctor_base<false,_wasm::WATParser::NaNKind,_wasm::Err>
                                         *)local_80);
                    if (_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u.
                        _24_1_ == '\x01') {
                      local_1d0[0] = &local_1c0;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)local_1d0,local_b0,
                                 (undefined1 *)
                                 (_val_1.val.
                                  super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  _M_u._0_8_ + (long)local_b0));
                      goto LAB_00c2f232;
                    }
                    std::__detail::__variant::
                    _Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err>::~_Variant_storage
                              ((_Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err> *)
                               local_b0);
                    local_b0._0_4_ = local_80._0_4_;
                    _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._0_8_ = 5
                    ;
                    _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._16_1_ =
                         1;
                    std::
                    vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>
                    ::emplace_back<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>
                              ((vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>
                                *)auStack_2e8,
                               (variant<wasm::Literal,_wasm::WATParser::NaNResult> *)local_b0);
                    std::__detail::__variant::
                    _Variant_storage<false,_wasm::Literal,_wasm::WATParser::NaNResult>::
                    ~_Variant_storage((_Variant_storage<false,_wasm::Literal,_wasm::WATParser::NaNResult>
                                       *)local_b0);
                    std::__detail::__variant::
                    _Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err>::~_Variant_storage
                              ((_Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err> *)
                               local_80);
                  }
                  else {
                    local_b0 = oVar17.super__Optional_base<double,_true,_true>._M_payload.
                               super__Optional_payload_base<double>._M_payload;
                    _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_ = 5
                    ;
                    Literal::Literal((Literal *)local_80,(Literal *)local_b0);
                    kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._16_1_ =
                         0;
                    std::
                    vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>
                    ::emplace_back<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>
                              ((vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>
                                *)auStack_2e8,
                               (variant<wasm::Literal,_wasm::WATParser::NaNResult> *)local_80);
                    std::__detail::__variant::
                    _Variant_storage<false,_wasm::Literal,_wasm::WATParser::NaNResult>::
                    ~_Variant_storage((_Variant_storage<false,_wasm::Literal,_wasm::WATParser::NaNResult>
                                       *)local_80);
                    Literal::~Literal((Literal *)local_b0);
                  }
                  iVar16 = iVar16 + -1;
                } while (iVar16 == 0);
                goto LAB_00c2eb8e;
              }
              local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
              local_b0 = (undefined1  [8])0x17;
              local_3a8._M_dataplus._M_p =
                   (pointer)std::__cxx11::string::_M_create((ulong *)&local_3a8,(ulong)local_b0);
              local_3a8.field_2._M_allocated_capacity = (size_type)local_b0;
              builtin_strncpy(local_3a8._M_dataplus._M_p,"unexpected vector shape",0x17);
              local_3a8._M_string_length = (size_type)local_b0;
              local_3a8._M_dataplus._M_p[(long)local_b0] = '\0';
              Lexer::err((Err *)local_80,in,&local_3a8);
              kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ = &local_48;
              pvVar1 = (variant<wasm::Literal,_wasm::WATParser::NaNResult> *)
                       ((long)&kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                               super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                               super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                               super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 8);
              if (local_80 == (undefined1  [8])pvVar1) {
                uStack_40 = CONCAT71(kind.val.
                                     super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                     ._M_u._17_7_,
                                     kind.val.
                                     super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                     ._M_u._16_1_);
              }
              else {
                kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ = local_80;
              }
              local_48 = (pointer)kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  _M_u._8_8_;
              kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._0_8_ = 0;
              kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_ =
                   kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_ &
                   0xffffffffffffff00;
              local_38 = '\x01';
              uVar10 = local_3a8.field_2._M_allocated_capacity;
              _Var13._M_p = local_3a8._M_dataplus._M_p;
              local_80 = (undefined1  [8])pvVar1;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) goto LAB_00c2f1fd;
            }
LAB_00c2f285:
            std::
            vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
            ::~vector((vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                       *)auStack_2e8);
          }
          else {
            expected_04._M_str = "ref.extern";
            expected_04._M_len = 10;
            bVar8 = Lexer::takeSExprStart(in,expected_04);
            if (bVar8) {
              bVar8 = Lexer::takeRParen(in);
              if (bVar8) {
                kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_index = '\b';
                kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._33_7_ = 0;
LAB_00c2f56b:
                uStack_40 = CONCAT71(uStack_40._1_7_,1);
                local_38 = '\0';
              }
              else {
                local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
                local_b0 = (undefined1  [8])0x1a;
                local_368._M_dataplus._M_p =
                     (pointer)std::__cxx11::string::_M_create((ulong *)&local_368,(ulong)local_b0);
                local_368.field_2._M_allocated_capacity = (size_type)local_b0;
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_368._M_dataplus._M_p + 10) = 'n';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_368._M_dataplus._M_p + 0xb) = 'd';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_368._M_dataplus._M_p + 0xc) = ' ';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_368._M_dataplus._M_p + 0xd) = 'o';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_368._M_dataplus._M_p + 0xe) = 'f';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_368._M_dataplus._M_p + 0xf) = ' ';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_368._M_dataplus._M_p + 0x10) = 'r';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_368._M_dataplus._M_p + 0x11) = 'e';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_368._M_dataplus._M_p + 0x12) = 'f';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_368._M_dataplus._M_p + 0x13) = '.';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_368._M_dataplus._M_p + 0x14) = 'e';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_368._M_dataplus._M_p + 0x15) = 'x';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_368._M_dataplus._M_p + 0x16) = 't';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_368._M_dataplus._M_p + 0x17) = 'e';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_368._M_dataplus._M_p + 0x18) = 'r';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_368._M_dataplus._M_p + 0x19) = 'n';
                *(undefined8 *)local_368._M_dataplus._M_p = 0x6465746365707865;
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_368._M_dataplus._M_p + 8) = ' ';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_368._M_dataplus._M_p + 9) = 'e';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_368._M_dataplus._M_p + 10) = 'n';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_368._M_dataplus._M_p + 0xb) = 'd';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_368._M_dataplus._M_p + 0xc) = ' ';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_368._M_dataplus._M_p + 0xd) = 'o';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_368._M_dataplus._M_p + 0xe) = 'f';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_368._M_dataplus._M_p + 0xf) = ' ';
                local_368._M_string_length = (size_type)local_b0;
                local_368._M_dataplus._M_p[(long)local_b0] = '\0';
                Lexer::err((Err *)local_80,in,&local_368);
                kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ = &local_48
                ;
                pvVar1 = (variant<wasm::Literal,_wasm::WATParser::NaNResult> *)
                         ((long)&kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                 super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 8);
                if (local_80 == (undefined1  [8])pvVar1) {
                  uStack_40 = CONCAT71(kind.val.
                                       super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       .
                                       super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       .super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       ._M_u._17_7_,
                                       kind.val.
                                       super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       .
                                       super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       .super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       ._M_u._16_1_);
                }
                else {
                  kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ =
                       local_80;
                }
                local_48 = (pointer)kind.val.
                                    super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                    super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                    super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                    ._M_u._8_8_;
                kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._0_8_ = 0;
                kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_ =
                     kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_ &
                     0xffffffffffffff00;
                local_38 = '\x01';
                uVar10 = local_368.field_2._M_allocated_capacity;
                _Var13._M_p = local_368._M_dataplus._M_p;
                local_80 = (undefined1  [8])pvVar1;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_368._M_dataplus._M_p != &local_368.field_2) goto LAB_00c2f7fe;
              }
            }
            else {
              expected_06._M_str = "ref.func";
              expected_06._M_len = 8;
              bVar8 = Lexer::takeSExprStart(in,expected_06);
              if (bVar8) {
                bVar8 = Lexer::takeRParen(in);
                if (bVar8) {
                  kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_index =
                       '\x10';
                  kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._33_7_ = 0;
                  goto LAB_00c2f56b;
                }
                local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
                local_b0 = (undefined1  [8])0x18;
                local_348._M_dataplus._M_p =
                     (pointer)std::__cxx11::string::_M_create((ulong *)&local_348,(ulong)local_b0);
                local_348.field_2._M_allocated_capacity = (size_type)local_b0;
                *(undefined8 *)local_348._M_dataplus._M_p = 0x6465746365707865;
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_348._M_dataplus._M_p + 8) = ' ';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_348._M_dataplus._M_p + 9) = 'e';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_348._M_dataplus._M_p + 10) = 'n';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_348._M_dataplus._M_p + 0xb) = 'd';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_348._M_dataplus._M_p + 0xc) = ' ';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_348._M_dataplus._M_p + 0xd) = 'o';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_348._M_dataplus._M_p + 0xe) = 'f';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_348._M_dataplus._M_p + 0xf) = ' ';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_348._M_dataplus._M_p + 0x10) = 'r';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_348._M_dataplus._M_p + 0x11) = 'e';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_348._M_dataplus._M_p + 0x12) = 'f';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_348._M_dataplus._M_p + 0x13) = '.';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_348._M_dataplus._M_p + 0x14) = 'f';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_348._M_dataplus._M_p + 0x15) = 'u';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_348._M_dataplus._M_p + 0x16) = 'n';
                *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_348._M_dataplus._M_p + 0x17) = 'c';
                local_348._M_string_length = (size_type)local_b0;
                local_348._M_dataplus._M_p[(long)local_b0] = '\0';
                Lexer::err((Err *)local_80,in,&local_348);
                kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ = &local_48
                ;
                pvVar1 = (variant<wasm::Literal,_wasm::WATParser::NaNResult> *)
                         ((long)&kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                 super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 8);
                if (local_80 == (undefined1  [8])pvVar1) {
                  uStack_40 = CONCAT71(kind.val.
                                       super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       .
                                       super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       .super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       ._M_u._17_7_,
                                       kind.val.
                                       super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       .
                                       super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       .super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       ._M_u._16_1_);
                }
                else {
                  kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ =
                       local_80;
                }
                local_48 = (pointer)kind.val.
                                    super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                    super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                    super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                    ._M_u._8_8_;
                kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._0_8_ = 0;
                kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_ =
                     kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                     super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_ &
                     0xffffffffffffff00;
                local_38 = '\x01';
                uVar10 = local_348.field_2._M_allocated_capacity;
                _Var13._M_p = local_348._M_dataplus._M_p;
                local_80 = (undefined1  [8])pvVar1;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_348._M_dataplus._M_p != &local_348.field_2) goto LAB_00c2f7fe;
              }
              else {
                expected_07._M_str = "ref.struct";
                expected_07._M_len = 10;
                bVar8 = Lexer::takeSExprStart(in,expected_07);
                if (bVar8) {
                  bVar8 = Lexer::takeRParen(in);
                  if (bVar8) {
                    kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_index = '8'
                    ;
                    kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._33_7_ = 0;
                    goto LAB_00c2f56b;
                  }
                  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
                  local_b0 = (undefined1  [8])0x1a;
                  local_328._M_dataplus._M_p =
                       (pointer)std::__cxx11::string::_M_create((ulong *)&local_328,(ulong)local_b0)
                  ;
                  local_328.field_2._M_allocated_capacity = (size_type)local_b0;
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_328._M_dataplus._M_p + 10) = 'n';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_328._M_dataplus._M_p + 0xb) = 'd';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_328._M_dataplus._M_p + 0xc) = ' ';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_328._M_dataplus._M_p + 0xd) = 'o';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_328._M_dataplus._M_p + 0xe) = 'f';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_328._M_dataplus._M_p + 0xf) = ' ';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_328._M_dataplus._M_p + 0x10) = 'r';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_328._M_dataplus._M_p + 0x11) = 'e';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_328._M_dataplus._M_p + 0x12) = 'f';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_328._M_dataplus._M_p + 0x13) = '.';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_328._M_dataplus._M_p + 0x14) = 's';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_328._M_dataplus._M_p + 0x15) = 't';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_328._M_dataplus._M_p + 0x16) = 'r';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_328._M_dataplus._M_p + 0x17) = 'u';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_328._M_dataplus._M_p + 0x18) = 'c';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_328._M_dataplus._M_p + 0x19) = 't';
                  *(undefined8 *)local_328._M_dataplus._M_p = 0x6465746365707865;
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_328._M_dataplus._M_p + 8) = ' ';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_328._M_dataplus._M_p + 9) = 'e';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_328._M_dataplus._M_p + 10) = 'n';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_328._M_dataplus._M_p + 0xb) = 'd';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_328._M_dataplus._M_p + 0xc) = ' ';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_328._M_dataplus._M_p + 0xd) = 'o';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_328._M_dataplus._M_p + 0xe) = 'f';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_328._M_dataplus._M_p + 0xf) = ' ';
                  local_328._M_string_length = (size_type)local_b0;
                  local_328._M_dataplus._M_p[(long)local_b0] = '\0';
                  Lexer::err((Err *)local_80,in,&local_328);
                  kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ =
                       &local_48;
                  pvVar1 = (variant<wasm::Literal,_wasm::WATParser::NaNResult> *)
                           ((long)&kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>
                                   .super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 8);
                  if (local_80 == (undefined1  [8])pvVar1) {
                    uStack_40 = CONCAT71(kind.val.
                                         super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                         super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                         .
                                         super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                         .
                                         super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                         .
                                         super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                         .
                                         super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                         ._M_u._17_7_,
                                         kind.val.
                                         super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                         super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                         .
                                         super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                         .
                                         super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                         .
                                         super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                         .
                                         super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                         ._M_u._16_1_);
                  }
                  else {
                    kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ =
                         local_80;
                  }
                  local_48 = (pointer)kind.val.
                                      super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                      super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                      super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                      ._M_u._8_8_;
                  kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._0_8_ = 0;
                  kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_ =
                       kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                       super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                       super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                       super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_
                       & 0xffffffffffffff00;
                  local_38 = '\x01';
                  uVar10 = local_328.field_2._M_allocated_capacity;
                  _Var13._M_p = local_328._M_dataplus._M_p;
                  local_80 = (undefined1  [8])pvVar1;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_328._M_dataplus._M_p != &local_328.field_2) goto LAB_00c2f7fe;
                }
                else {
                  expected_08._M_str = "ref.array";
                  expected_08._M_len = 9;
                  bVar8 = Lexer::takeSExprStart(in,expected_08);
                  if (bVar8) {
                    bVar8 = Lexer::takeRParen(in);
                    if (bVar8) {
                      kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_index =
                           '@';
                      kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._33_7_ = 0;
                      goto LAB_00c2f56b;
                    }
                    local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
                    local_b0 = (undefined1  [8])&DAT_00000019;
                    local_308._M_dataplus._M_p =
                         (pointer)std::__cxx11::string::_M_create
                                            ((ulong *)&local_308,(ulong)local_b0);
                    local_308.field_2._M_allocated_capacity = (size_type)local_b0;
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p + 9) = 'e';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p + 10) = 'n';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p + 0xb) = 'd';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p + 0xc) = ' ';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p + 0xd) = 'o';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p + 0xe) = 'f';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p + 0xf) = ' ';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p + 0x10) = 'r';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p + 0x11) = 'e';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p + 0x12) = 'f';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p + 0x13) = '.';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p + 0x14) = 'a';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p + 0x15) = 'r';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p + 0x16) = 'r';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p + 0x17) = 'a';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p + 0x18) = 'y';
                    *(undefined8 *)local_308._M_dataplus._M_p = 0x6465746365707865;
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p + 8) = ' ';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p + 9) = 'e';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p + 10) = 'n';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p + 0xb) = 'd';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p + 0xc) = ' ';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p + 0xd) = 'o';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p + 0xe) = 'f';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p + 0xf) = ' ';
                    local_308._M_string_length = (size_type)local_b0;
                    local_308._M_dataplus._M_p[(long)local_b0] = '\0';
                    Lexer::err((Err *)local_80,in,&local_308);
                    kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ =
                         &local_48;
                    pvVar1 = (variant<wasm::Literal,_wasm::WATParser::NaNResult> *)
                             ((long)&kind.val.
                                     super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 8
                             );
                    if (local_80 == (undefined1  [8])pvVar1) {
                      uStack_40 = CONCAT71(kind.val.
                                           super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                           super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                           .
                                           super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                           .
                                           super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                           .
                                           super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                           .
                                           super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                           ._M_u._17_7_,
                                           kind.val.
                                           super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                           super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                           .
                                           super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                           .
                                           super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                           .
                                           super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                           .
                                           super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                           ._M_u._16_1_);
                    }
                    else {
                      kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ =
                           local_80;
                    }
                    local_48 = (pointer)kind.val.
                                        super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                        .
                                        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                        .super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                        .super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                        .
                                        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                        ._M_u._8_8_;
                    kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._0_8_ = 0
                    ;
                    kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_ =
                         kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                         super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u.
                         _8_8_ & 0xffffffffffffff00;
                    local_38 = '\x01';
                    uVar10 = local_308.field_2._M_allocated_capacity;
                    _Var13._M_p = local_308._M_dataplus._M_p;
                    local_80 = (undefined1  [8])pvVar1;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_308._M_dataplus._M_p != &local_308.field_2) goto LAB_00c2f7fe;
                  }
                  else {
                    expected_09._M_str = "ref.eq";
                    expected_09._M_len = 6;
                    bVar8 = Lexer::takeSExprStart(in,expected_09);
                    if (bVar8) {
                      bVar8 = Lexer::takeRParen(in);
                      if (bVar8) {
                        kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_index =
                             '(';
                        kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._33_7_ = 0
                        ;
                        goto LAB_00c2f56b;
                      }
                      local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_4c8,"expected end of ref.eq","");
                      Lexer::err((Err *)local_80,in,&local_4c8);
                      kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ =
                           &local_48;
                      pvVar1 = (variant<wasm::Literal,_wasm::WATParser::NaNResult> *)
                               ((long)&kind.val.
                                       super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       .
                                       super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       .super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> +
                               8);
                      if (local_80 == (undefined1  [8])pvVar1) {
                        uStack_40 = CONCAT71(kind.val.
                                             super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>
                                             .
                                             super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                             .
                                             super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                             .
                                             super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                             .
                                             super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                             .
                                             super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                             ._M_u._17_7_,
                                             kind.val.
                                             super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>
                                             .
                                             super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                             .
                                             super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                             .
                                             super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                             .
                                             super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                             .
                                             super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                             ._M_u._16_1_);
                      }
                      else {
                        kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ =
                             local_80;
                      }
                      local_48 = (pointer)kind.val.
                                          super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                          .
                                          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                          .
                                          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                          .
                                          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                          .
                                          super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                          ._M_u._8_8_;
                      kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._0_8_ =
                           0;
                      kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_ =
                           kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u.
                           _8_8_ & 0xffffffffffffff00;
                      local_38 = '\x01';
                      uVar10 = local_4c8.field_2._M_allocated_capacity;
                      _Var13._M_p = local_4c8._M_dataplus._M_p;
                      local_80 = (undefined1  [8])pvVar1;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) goto LAB_00c2f7fe;
                    }
                    else {
                      expected_10._M_str = "ref.i31";
                      expected_10._M_len = 7;
                      bVar8 = Lexer::takeSExprStart(in,expected_10);
                      if (bVar8) {
                        bVar8 = Lexer::takeRParen(in);
                        if (bVar8) {
                          kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_index
                               = '0';
                          kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._33_7_ =
                               0;
                          goto LAB_00c2f56b;
                        }
                        local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_4a8,"expected end of ref.i31","");
                        Lexer::err((Err *)local_80,in,&local_4a8);
                        kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ =
                             &local_48;
                        pvVar1 = (variant<wasm::Literal,_wasm::WATParser::NaNResult> *)
                                 ((long)&kind.val.
                                         super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                         super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                         .
                                         super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                         .
                                         super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                         .
                                         super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                 + 8);
                        if (local_80 == (undefined1  [8])pvVar1) {
                          uStack_40 = CONCAT71(kind.val.
                                               super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>
                                               .
                                               super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                               .
                                               super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                               .
                                               super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                               .
                                               super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                               .
                                               super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                               ._M_u._17_7_,
                                               kind.val.
                                               super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>
                                               .
                                               super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                               .
                                               super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                               .
                                               super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                               .
                                               super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                               .
                                               super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                               ._M_u._16_1_);
                        }
                        else {
                          kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ =
                               local_80;
                        }
                        local_48 = (pointer)kind.val.
                                            super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>
                                            .
                                            super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                            .
                                            super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                            .
                                            super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                            .
                                            super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                            .
                                            super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                            ._M_u._8_8_;
                        kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._0_8_
                             = 0;
                        kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_
                             = kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                               super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                               super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                               super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                               super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                               _M_u._8_8_ & 0xffffffffffffff00;
                        local_38 = '\x01';
                        uVar10 = local_4a8.field_2._M_allocated_capacity;
                        _Var13._M_p = local_4a8._M_dataplus._M_p;
                        local_80 = (undefined1  [8])pvVar1;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) goto LAB_00c2f7fe;
                      }
                      else {
                        expected_11._M_str = "ref.i31_shared";
                        expected_11._M_len = 0xe;
                        bVar8 = Lexer::takeSExprStart(in,expected_11);
                        if (bVar8) {
                          bVar8 = Lexer::takeRParen(in);
                          if (bVar8) {
                            kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            _M_index = '4';
                            kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._33_7_
                                 = 0;
                            goto LAB_00c2f56b;
                          }
                          local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_488,"expected end of ref.i31_shared","");
                          Lexer::err((Err *)local_80,in,&local_488);
                          kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ =
                               &local_48;
                          if (local_80 ==
                              (undefined1  [8])
                              ((long)&kind.val.
                                      super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                      super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> +
                              8U)) {
                            uStack_40 = CONCAT71(kind.val.
                                                 super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>
                                                 .
                                                 super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                 .
                                                 super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                 .
                                                 super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                 .
                                                 super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                 .
                                                 super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                 ._M_u._17_7_,
                                                 kind.val.
                                                 super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>
                                                 .
                                                 super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                 .
                                                 super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                 .
                                                 super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                 .
                                                 super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                 .
                                                 super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                 ._M_u._16_1_);
                          }
                          else {
                            kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_
                                 = local_80;
                          }
                          local_48 = (pointer)kind.val.
                                              super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>
                                              .
                                              super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                              .
                                              super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                              .
                                              super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                              .
                                              super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                              .
                                              super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                              ._M_u._8_8_;
                          kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u.
                          _0_8_ = 0;
                          kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u.
                          _8_8_ = kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  _M_u._8_8_ & 0xffffffffffffff00;
                          local_38 = '\x01';
                          uVar10 = local_488.field_2._M_allocated_capacity;
                          _Var13._M_p = local_488._M_dataplus._M_p;
                          local_80 = (undefined1  [8])
                                     ((long)&kind.val.
                                             super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>
                                             .
                                             super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                             .
                                             super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                             .
                                             super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                             .
                                             super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                     + 8);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_488._M_dataplus._M_p != &local_488.field_2)
                          goto LAB_00c2f7fe;
                        }
                        else {
                          local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_468,"unrecognized result","");
                          Lexer::err((Err *)local_80,in,&local_468);
                          kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ =
                               &local_48;
                          pvVar1 = (variant<wasm::Literal,_wasm::WATParser::NaNResult> *)
                                   ((long)&kind.val.
                                           super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                           super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                           .
                                           super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                           .
                                           super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                           .
                                           super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                   + 8);
                          if (local_80 == (undefined1  [8])pvVar1) {
                            uStack_40 = CONCAT71(kind.val.
                                                 super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>
                                                 .
                                                 super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                 .
                                                 super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                 .
                                                 super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                 .
                                                 super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                 .
                                                 super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                 ._M_u._17_7_,
                                                 kind.val.
                                                 super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>
                                                 .
                                                 super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                 .
                                                 super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                 .
                                                 super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                 .
                                                 super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                 .
                                                 super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                 ._M_u._16_1_);
                          }
                          else {
                            kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_
                                 = local_80;
                          }
                          local_48 = (pointer)kind.val.
                                              super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>
                                              .
                                              super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                              .
                                              super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                              .
                                              super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                              .
                                              super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                              .
                                              super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                              ._M_u._8_8_;
                          kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u.
                          _0_8_ = 0;
                          kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u.
                          _8_8_ = kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                  _M_u._8_8_ & 0xffffffffffffff00;
                          local_38 = '\x01';
                          uVar10 = local_468.field_2._M_allocated_capacity;
                          _Var13._M_p = local_468._M_dataplus._M_p;
                          local_80 = (undefined1  [8])pvVar1;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_468._M_dataplus._M_p != &local_468.field_2) {
LAB_00c2f7fe:
                            local_80 = (undefined1  [8])
                                       ((long)&kind.val.
                                               super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>
                                               .
                                               super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                               .
                                               super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                               .
                                               super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                               .
                                               super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                       + 8);
                            local_38 = '\x01';
                            kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u.
                            _0_8_ = 0;
                            operator_delete(_Var13._M_p,(ulong)(uVar10 + 1));
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
LAB_00c2ef85:
        std::__detail::__variant::_Variant_storage<false,_wasm::Literal,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::Literal,_wasm::Err> *)local_240);
        if ((_val.val.
             super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             ._M_u._M_first._M_storage._M_storage[0x38] == '\x01') &&
           (_val.val.
            super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            ._M_u._M_first._M_storage._M_storage[0x38] = '\0',
           (undefined1 *)
           _val.val.
           super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
           .
           super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
           .
           super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
           .
           super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
           .
           super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
           .
           super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
           ._M_u._24_8_ !=
           (undefined1 *)
           ((long)&_val.val.
                   super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
           + 0x28U))) {
          operator_delete((void *)_val.val.
                                  super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                  .
                                  super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                  .
                                  super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                  .
                                  super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                  .
                                  super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                  .
                                  super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                  ._M_u._24_8_,
                          _val.val.
                          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          ._M_u._40_8_ + 1);
        }
        if (_val.val.
            super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            ._M_u._0_8_ != 0) {
          operator_delete((void *)_val.val.
                                  super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                  .
                                  super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                  .
                                  super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                  .
                                  super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                  .
                                  super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                  .
                                  super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                  ._M_u._0_8_,
                          _val.val.
                          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          ._M_u._16_8_ -
                          _val.val.
                          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          ._M_u._0_8_);
        }
        std::__detail::__variant::
        _Copy_ctor_base<false,_std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_wasm::Err>
        ::_Copy_ctor_base((_Copy_ctor_base<false,_std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_wasm::Err>
                           *)this_00,
                          (_Copy_ctor_base<false,_std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_wasm::Err>
                           *)((long)&kind.val.
                                     super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> +
                             0x20));
        if (_val.val.
            super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            ._M_u._M_first._M_storage._M_storage[0x18] == '\x01') {
          pvVar1 = (variant<wasm::Literal,_wasm::WATParser::NaNResult> *)
                   ((long)&c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                           super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 8);
          local_240 = (undefined1  [8])pvVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_240,
                     a.val.
                     super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     ._104_8_,_val.val.
                              super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              .
                              super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              .
                              super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              .
                              super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              .
                              super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              .
                              super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              ._M_u._0_8_ +
                              a.val.
                              super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              .
                              super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              .
                              super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              .
                              super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              .
                              super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              .
                              super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              ._104_8_);
          local_448._0_8_ = &local_438;
          if (local_240 == (undefined1  [8])pvVar1) {
            local_438.super__Variant_base<wasm::Literal,_wasm::WATParser::NaNResult>.
            super__Move_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
            super__Copy_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
            super__Move_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
            super__Copy_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
            super__Variant_storage_alias<wasm::Literal,_wasm::WATParser::NaNResult>._M_u._8_8_ =
                 c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                 super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._16_8_;
          }
          else {
            local_448._0_8_ = local_240;
          }
          local_438.super__Variant_base<wasm::Literal,_wasm::WATParser::NaNResult>.
          super__Move_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
          super__Copy_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
          super__Move_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
          super__Copy_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
          super__Variant_storage_alias<wasm::Literal,_wasm::WATParser::NaNResult>._M_u._0_8_ =
               c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
               super__Move_assign_alias<wasm::Literal,_wasm::Err>.
               super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
               super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
               super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._8_8_;
          local_448._8_8_ =
               c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
               super__Move_assign_alias<wasm::Literal,_wasm::Err>.
               super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
               super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
               super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._0_8_;
          local_438.super__Variant_base<wasm::Literal,_wasm::WATParser::NaNResult>.
          super__Move_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
          super__Copy_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
          super__Move_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
          super__Copy_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
          super__Variant_storage_alias<wasm::Literal,_wasm::WATParser::NaNResult>._M_u._M_first.
          _M_storage._M_storage[0x10] = '\x01';
          std::__detail::__variant::
          _Variant_storage<false,_std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_wasm::Err>
          ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_wasm::Err>
                               *)((long)&a.val.
                                         super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                         .
                                         super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                         .
                                         super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                         .
                                         super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                         .
                                         super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                 + 0x68));
          std::__detail::__variant::
          _Variant_storage<false,_std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_wasm::Err>
          ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_wasm::Err>
                               *)((long)&kind.val.
                                         super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                         super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                         .
                                         super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                         .
                                         super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                         .
                                         super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                 + 0x20));
          goto LAB_00c2f8fa;
        }
        std::__detail::__variant::
        _Variant_storage<false,_std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_wasm::Err>
        ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_wasm::Err>
                             *)this_00);
        this = (_Variant_storage<false,_std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_wasm::Err>
                *)((long)&kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 0x20);
        __args = (_Variant_storage<false,_std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_wasm::Err>
                  *)0x0;
        if (local_38 == '\0') {
          __args = this;
        }
        std::
        vector<std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>>>
        ::
        emplace_back<std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>>
                  ((vector<std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>>>
                    *)auStack_418,
                   (variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>
                    *)__args);
        std::__detail::__variant::
        _Variant_storage<false,_std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_wasm::Err>
        ::~_Variant_storage(this);
      }
      local_448._0_8_ = auStack_418;
      local_448._8_8_ =
           res.
           super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_438.super__Variant_base<wasm::Literal,_wasm::WATParser::NaNResult>.
      super__Move_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
      super__Copy_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
      super__Move_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
      super__Copy_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
      super__Variant_storage_alias<wasm::Literal,_wasm::WATParser::NaNResult>._M_u._0_8_ =
           res.
           super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      auStack_418 = (undefined1  [8])0x0;
      res.
      super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      res.
      super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_438.super__Variant_base<wasm::Literal,_wasm::WATParser::NaNResult>.
      super__Move_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
      super__Copy_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
      super__Move_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
      super__Copy_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
      super__Variant_storage_alias<wasm::Literal,_wasm::WATParser::NaNResult>._M_u._M_first.
      _M_storage._M_storage[0x10] = '\0';
LAB_00c2f8fa:
      std::
      vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>
      ::~vector((vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>
                 *)auStack_418);
      std::__detail::__variant::
      _Copy_ctor_base<false,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>,_wasm::Err>
      ::_Copy_ctor_base((_Copy_ctor_base<false,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>,_wasm::Err>
                         *)((long)&a.val.
                                   super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                   .
                                   super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                   .
                                   super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                   .
                                   super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                   .
                                   super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           + 0x68),
                        (_Copy_ctor_base<false,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>,_wasm::Err>
                         *)local_448);
      if (_val.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_u._M_first._M_storage._M_storage[0x18] == '\x01') {
        pvVar1 = (variant<wasm::Literal,_wasm::WATParser::NaNResult> *)
                 ((long)&c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                         super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 8);
        local_240 = (undefined1  [8])pvVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_240,
                   a.val.
                   super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   ._104_8_,_val.val.
                            super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                            .
                            super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                            .
                            super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                            .
                            super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                            .
                            super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                            .
                            super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                            ._M_u._0_8_ +
                            a.val.
                            super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                            .
                            super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                            .
                            super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                            .
                            super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                            .
                            super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                            .
                            super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                            ._104_8_);
        lanes.
        super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)((long)&a_2.val.
                              super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              .
                              super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              .
                              super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              .
                              super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              .
                              super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      + 8);
        if (local_240 == (undefined1  [8])pvVar1) {
          a_2.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_u._16_8_ = c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                         super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._16_8_;
        }
        else {
          lanes.
          super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_240;
        }
        a_2.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._8_8_ = c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                      super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._8_8_;
        a_2.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._0_8_ = c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                      super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._0_8_;
        local_250 = '\x02';
        std::__detail::__variant::
        _Variant_storage<false,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>,_wasm::Err>
        ::~_Variant_storage((_Variant_storage<false,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>,_wasm::Err>
                             *)((long)&a.val.
                                       super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                       .
                                       super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                       .
                                       super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                       .
                                       super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                       .
                                       super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                               + 0x68));
      }
      else {
        std::__detail::__variant::
        _Variant_storage<false,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>,_wasm::Err>
        ::~_Variant_storage((_Variant_storage<false,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>,_wasm::Err>
                             *)((long)&a.val.
                                       super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                       .
                                       super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                       .
                                       super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                       .
                                       super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                       .
                                       super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                               + 0x68));
        bVar8 = Lexer::takeRParen(in);
        if (bVar8) {
          __rhs = (_Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                   *)0x0;
          if (a.val.
              super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              .
              super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              .
              super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              .
              super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              .
              super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              .
              super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              ._M_u._M_first._M_storage._M_storage[0x60] == '\0') {
            __rhs = (_Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                     *)local_1b0;
          }
          std::__detail::__variant::
          _Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>::
          _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                           *)((long)&a.val.
                                     super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                     .
                                     super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                     .
                                     super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                     .
                                     super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                     .
                                     super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             + 0x68),__rhs);
          this_01 = (vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>
                     *)((long)&_val.val.
                               super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                               .
                               super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                               .
                               super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                               .
                               super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                               .
                               super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       + 0x60);
          __x = (_Copy_ctor_base<false,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>,_wasm::Err>
                 *)0x0;
          if (local_438.super__Variant_base<wasm::Literal,_wasm::WATParser::NaNResult>.
              super__Move_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
              super__Copy_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
              super__Move_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
              super__Copy_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
              super__Variant_storage_alias<wasm::Literal,_wasm::WATParser::NaNResult>._M_u._M_first.
              _M_storage._M_storage[0x10] == '\0') {
            __x = (_Copy_ctor_base<false,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>,_wasm::Err>
                   *)local_448;
          }
          std::
          vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>
          ::vector(this_01,(vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>
                            *)__x);
          std::__detail::__variant::
          _Move_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>::
          _Move_ctor_base((_Move_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                           *)&lanes.
                              super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (_Move_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                           *)((long)&a.val.
                                     super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                     .
                                     super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                     .
                                     super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                     .
                                     super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                     .
                                     super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             + 0x68));
          a_2.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_u._96_8_ = _val.val.
                         super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         ._M_u._96_8_;
          a_2.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_index = _val.val.
                      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      ._M_index;
          a_2.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._105_7_ = _val.val.
                     super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     ._105_7_;
          _val.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_u._96_8_ = 0;
          _val.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_index = '\0';
          _val.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._105_7_ = 0;
          local_250 = '\0';
          std::
          vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>
          ::~vector(this_01);
          std::__detail::__variant::
          _Variant_storage<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>::
          ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                             *)((long)&a.val.
                                       super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                       .
                                       super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                       .
                                       super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                       .
                                       super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                       .
                                       super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                               + 0x68));
        }
        else {
          pvVar1 = (variant<wasm::Literal,_wasm::WATParser::NaNResult> *)
                   ((long)&c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                           super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 8);
          local_80 = (undefined1  [8])0x1d;
          local_240 = (undefined1  [8])pvVar1;
          local_240 = (undefined1  [8])
                      std::__cxx11::string::_M_create((ulong *)local_240,(ulong)local_80);
          c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
          super__Move_assign_alias<wasm::Literal,_wasm::Err>.
          super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
          super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
          super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._8_8_ = local_80;
          builtin_strncpy((char *)((long)&(((variant<wasm::Literal,_wasm::WATParser::NaNResult> *)
                                           local_240)->
                                          super__Variant_base<wasm::Literal,_wasm::WATParser::NaNResult>
                                          ).
                                          super__Move_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>
                                          .
                                          super__Copy_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>
                                          .
                                          super__Move_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>
                                          .
                                          super__Copy_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>
                                          .
                                          super__Variant_storage_alias<wasm::Literal,_wasm::WATParser::NaNResult>
                                          ._M_u + 0xd),"of asser",8);
          builtin_strncpy((char *)((long)&(((variant<wasm::Literal,_wasm::WATParser::NaNResult> *)
                                           local_240)->
                                          super__Variant_base<wasm::Literal,_wasm::WATParser::NaNResult>
                                          ).
                                          super__Move_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>
                                          .
                                          super__Copy_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>
                                          .
                                          super__Move_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>
                                          .
                                          super__Copy_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>
                                          .
                                          super__Variant_storage_alias<wasm::Literal,_wasm::WATParser::NaNResult>
                                          ._M_u + 0x15),"t_return",8);
          *(undefined8 *)
           &(((variant<wasm::Literal,_wasm::WATParser::NaNResult> *)local_240)->
            super__Variant_base<wasm::Literal,_wasm::WATParser::NaNResult>).
            super__Move_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
            super__Copy_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
            super__Move_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
            super__Copy_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
            super__Variant_storage_alias<wasm::Literal,_wasm::WATParser::NaNResult>._M_u =
               0x6465746365707865;
          builtin_strncpy((char *)((long)&(((variant<wasm::Literal,_wasm::WATParser::NaNResult> *)
                                           local_240)->
                                          super__Variant_base<wasm::Literal,_wasm::WATParser::NaNResult>
                                          ).
                                          super__Move_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>
                                          .
                                          super__Copy_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>
                                          .
                                          super__Move_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>
                                          .
                                          super__Copy_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>
                                          .
                                          super__Variant_storage_alias<wasm::Literal,_wasm::WATParser::NaNResult>
                                          ._M_u + 8)," end of ",8);
          c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
          super__Move_assign_alias<wasm::Literal,_wasm::Err>.
          super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
          super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
          super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._0_8_ = local_80;
          *(undefined1 *)
           ((long)&(((variant<wasm::Literal,_wasm::WATParser::NaNResult> *)local_240)->
                   super__Variant_base<wasm::Literal,_wasm::WATParser::NaNResult>).
                   super__Move_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
                   super__Copy_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
                   super__Move_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
                   super__Copy_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
                   super__Variant_storage_alias<wasm::Literal,_wasm::WATParser::NaNResult>._M_u +
           (long)local_80) = 0;
          Lexer::err((Err *)((long)&a.val.
                                    super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                    .
                                    super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                    .
                                    super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                    .
                                    super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                    .
                                    super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                            + 0x68),in,(string *)local_240);
          lanes.
          super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)((long)&a_2.val.
                                super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                .
                                super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                .
                                super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                .
                                super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                .
                                super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        + 8);
          puVar3 = (undefined1 *)
                   ((long)&_val.val.
                           super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           .
                           super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           .
                           super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           .
                           super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           .
                           super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   + 8);
          if ((undefined1 *)
              a.val.
              super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              .
              super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              .
              super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              .
              super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              .
              super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              .
              super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              ._104_8_ == puVar3) {
            a_2.val.
            super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            ._M_u._16_8_ = _val.val.
                           super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           .
                           super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           .
                           super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           .
                           super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           .
                           super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           .
                           super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           ._M_u._16_8_;
          }
          else {
            lanes.
            super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)a.val.
                          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          ._104_8_;
          }
          a_2.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_u._8_8_ = _val.val.
                        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        ._M_u._8_8_;
          a_2.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_u._0_8_ = _val.val.
                        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        ._M_u._0_8_;
          _val.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_u._0_8_ = 0;
          _val.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_u._8_8_ = _val.val.
                        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        ._M_u._8_8_ & 0xffffffffffffff00;
          local_250 = '\x02';
          a.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._104_8_ = puVar3;
          if (local_240 != (undefined1  [8])pvVar1) {
            operator_delete((void *)local_240,
                            c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                            super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._8_8_ + 1);
          }
        }
      }
      std::__detail::__variant::
      _Variant_storage<false,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>,_wasm::Err>
                           *)local_448);
    }
    std::__detail::__variant::
    _Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         *)local_1b0);
  }
  else {
    local_250 = '\x01';
  }
  if (local_250 == '\x01') {
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err> *)
               &lanes.
                super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    ppvVar4 = &lanes.
               super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::__detail::__variant::
    _Copy_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>::_Copy_ctor_base
              ((_Copy_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err> *)
               ((long)&a.val.
                       super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               + 0x68),(_Copy_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>
                        *)ppvVar4);
    if (local_c0 == '\x02') {
      puVar3 = (undefined1 *)
               ((long)&a.val.
                       super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               + 8);
      local_1b0 = (undefined1  [8])puVar3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1b0,
                 a.val.
                 super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 .
                 super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 .
                 super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 .
                 super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 .
                 super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 .
                 super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 ._104_8_,_val.val.
                          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          ._M_u._0_8_ +
                          a.val.
                          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          ._104_8_);
      *(undefined8 **)
       _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
       super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
       super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
       super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
       super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
       super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ =
           (undefined8 *)
           (_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ + 0x10);
      if (local_1b0 == (undefined1  [8])puVar3) {
        *(undefined8 *)
         (_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ + 0x10) =
             CONCAT71(a.val.
                      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      ._M_u._9_7_,
                      a.val.
                      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      ._M_u._M_first._M_storage._M_storage[8]);
        *(undefined8 *)
         (_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ + 0x18) =
             a.val.
             super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             ._M_u._16_8_;
      }
      else {
        *(undefined1 (*) [8])
         _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
         super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
         super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
         super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
         super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
         super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ = local_1b0;
        *(ulong *)(_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ + 0x10)
             = CONCAT71(a.val.
                        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        ._M_u._9_7_,
                        a.val.
                        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        ._M_u._M_first._M_storage._M_storage[8]);
      }
      *(undefined8 *)
       (_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ + 8) =
           a.val.
           super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
           .
           super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
           .
           super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
           .
           super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
           .
           super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
           .
           super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
           ._M_u._0_8_;
      a.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_u._0_8_ = 0;
      a.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_u._M_first._M_storage._M_storage[8] = '\0';
      *(undefined1 *)
       (_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ + 0x88) = 2;
      local_1b0 = (undefined1  [8])puVar3;
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>
                         *)((long)&a.val.
                                   super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                   .
                                   super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                   .
                                   super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                   .
                                   super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                   .
                                   super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           + 0x68));
    }
    else {
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>
                         *)((long)&a.val.
                                   super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                   .
                                   super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                   .
                                   super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                   .
                                   super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                   .
                                   super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           + 0x68));
      ppvVar12 = (pointer *)0x0;
      if (local_250 == '\0') {
        ppvVar12 = ppvVar4;
      }
      std::__detail::__variant::_Uninitialized<wasm::WATParser::AssertReturn,false>::
      _Uninitialized<wasm::WATParser::AssertReturn&>
                ((_Uninitialized<wasm::WATParser::AssertReturn,false> *)
                 ((long)&a.val.
                         super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 + 0x68),ppvVar12);
      uVar10 = _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
               super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
               super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
               super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
               super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
               super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_;
      std::__detail::__variant::
      _Move_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
      ::_Move_ctor_base((_Move_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                         *)_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_,
                        (_Move_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                         *)((long)&a.val.
                                   super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                   .
                                   super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                   .
                                   super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                   .
                                   super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                   .
                                   super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           + 0x68));
      *(undefined1 *)(uVar10 + 0x88) = 0;
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
      ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                           *)((long)&a.val.
                                     super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                     .
                                     super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                     .
                                     super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                     .
                                     super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                     .
                                     super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             + 0x68));
    }
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err> *)
               &lanes.
                super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (local_250 != '\x01') {
      return (MaybeResult<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
              *)_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_;
    }
  }
  expected_12._M_str = "assert_exception";
  expected_12._M_len = 0x10;
  bVar8 = Lexer::takeSExprStart(in,expected_12);
  if (bVar8) {
    ppvVar4 = &lanes.
               super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    action((Result<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_> *)
           ppvVar4,in);
    std::__detail::__variant::
    _Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       *)local_1b0,
                      (_Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       *)ppvVar4);
    if (a.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._M_first._M_storage._M_storage[0x60] == '\x01') {
      pvVar1 = (variant<wasm::Literal,_wasm::WATParser::NaNResult> *)
               ((long)&c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                       super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 8);
      local_240 = (undefined1  [8])pvVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_240,local_1b0,
                 (undefined1 *)
                 (a.val.
                  super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  ._M_u._0_8_ + (long)local_1b0));
      a.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._104_8_ = (long)&_val.val.
                        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 + 8;
      if (local_240 == (undefined1  [8])pvVar1) {
        _val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._16_8_ = c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                       super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._16_8_;
      }
      else {
        a.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._104_8_ = local_240;
      }
      _val.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_u._8_8_ = c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                    super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._8_8_;
      _val.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_u._0_8_ = c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                    super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._0_8_;
      _val.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_index = '\x02';
      std::__detail::__variant::
      _Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           *)local_1b0);
    }
    else {
      std::__detail::__variant::
      _Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           *)local_1b0);
      bVar8 = Lexer::takeRParen(in);
      if (bVar8) {
        local_1b0._0_4_ = 2;
        ppvVar12 = (pointer *)0x0;
        if (a_2.val.
            super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            ._M_u._M_first._M_storage._M_storage[0x60] == '\0') {
          ppvVar12 = ppvVar4;
        }
        std::__detail::__variant::
        _Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>::
        _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                         *)&a,(_Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                               *)ppvVar12);
        a.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._104_4_ = local_1b0._0_4_;
        std::__detail::__variant::
        _Move_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>::
        _Move_ctor_base((_Move_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                         *)&_val,(_Move_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                                  *)&a);
        _val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._104_8_ = _val.val.
                   super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   ._104_8_ & 0xffffffffffffff00;
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                           *)&a);
      }
      else {
        pvVar1 = (variant<wasm::Literal,_wasm::WATParser::NaNResult> *)
                 ((long)&c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                         super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 8);
        local_80 = (undefined1  [8])0x20;
        local_240 = (undefined1  [8])pvVar1;
        local_240 = (undefined1  [8])
                    std::__cxx11::string::_M_create((ulong *)local_240,(ulong)local_80);
        c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
        super__Move_assign_alias<wasm::Literal,_wasm::Err>.
        super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
        super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
        super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._8_8_ = local_80;
        builtin_strncpy((char *)((long)&(((variant<wasm::Literal,_wasm::WATParser::NaNResult> *)
                                         local_240)->
                                        super__Variant_base<wasm::Literal,_wasm::WATParser::NaNResult>
                                        ).
                                        super__Move_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>
                                        .
                                        super__Copy_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>
                                        .
                                        super__Move_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>
                                        .
                                        super__Copy_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>
                                        .
                                        super__Variant_storage_alias<wasm::Literal,_wasm::WATParser::NaNResult>
                                        ._M_u + 0x10),"assert_e",8);
        p_Var5 = &(((variant<wasm::Literal,_wasm::WATParser::NaNResult> *)local_240)->
                  super__Variant_base<wasm::Literal,_wasm::WATParser::NaNResult>).
                  super__Move_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
                  super__Copy_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>;
        (p_Var5->super__Move_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>).
        super__Copy_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
        super__Variant_storage_alias<wasm::Literal,_wasm::WATParser::NaNResult>._M_index = 'x';
        (p_Var5->super__Move_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>).
        super__Copy_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
        super__Variant_storage_alias<wasm::Literal,_wasm::WATParser::NaNResult>.field_0x19 = 'c';
        (p_Var5->super__Move_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>).
        super__Copy_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
        super__Variant_storage_alias<wasm::Literal,_wasm::WATParser::NaNResult>.field_0x1a = 'e';
        (p_Var5->super__Move_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>).
        super__Copy_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
        super__Variant_storage_alias<wasm::Literal,_wasm::WATParser::NaNResult>.field_0x1b = 'p';
        (p_Var5->super__Move_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>).
        super__Copy_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
        super__Variant_storage_alias<wasm::Literal,_wasm::WATParser::NaNResult>.field_0x1c = 't';
        (p_Var5->super__Move_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>).
        super__Copy_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
        super__Variant_storage_alias<wasm::Literal,_wasm::WATParser::NaNResult>.field_0x1d = 'i';
        (p_Var5->super__Move_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>).
        super__Copy_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
        super__Variant_storage_alias<wasm::Literal,_wasm::WATParser::NaNResult>.field_0x1e = 'o';
        (p_Var5->super__Move_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>).
        super__Copy_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
        super__Variant_storage_alias<wasm::Literal,_wasm::WATParser::NaNResult>.field_0x1f = 'n';
        *(undefined8 *)
         &(((variant<wasm::Literal,_wasm::WATParser::NaNResult> *)local_240)->
          super__Variant_base<wasm::Literal,_wasm::WATParser::NaNResult>).
          super__Move_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
          super__Copy_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
          super__Move_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
          super__Copy_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
          super__Variant_storage_alias<wasm::Literal,_wasm::WATParser::NaNResult>._M_u =
             0x6465746365707865;
        builtin_strncpy((char *)((long)&(((variant<wasm::Literal,_wasm::WATParser::NaNResult> *)
                                         local_240)->
                                        super__Variant_base<wasm::Literal,_wasm::WATParser::NaNResult>
                                        ).
                                        super__Move_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>
                                        .
                                        super__Copy_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>
                                        .
                                        super__Move_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>
                                        .
                                        super__Copy_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>
                                        .
                                        super__Variant_storage_alias<wasm::Literal,_wasm::WATParser::NaNResult>
                                        ._M_u + 8)," end of ",8);
        c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
        super__Move_assign_alias<wasm::Literal,_wasm::Err>.
        super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
        super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
        super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._0_8_ = local_80;
        *(undefined1 *)
         ((long)&(((variant<wasm::Literal,_wasm::WATParser::NaNResult> *)local_240)->
                 super__Variant_base<wasm::Literal,_wasm::WATParser::NaNResult>).
                 super__Move_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
                 super__Copy_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
                 super__Move_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
                 super__Copy_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
                 super__Variant_storage_alias<wasm::Literal,_wasm::WATParser::NaNResult>._M_u +
         (long)local_80) = 0;
        Lexer::err((Err *)local_1b0,in,(string *)local_240);
        a.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._104_8_ = (long)&_val.val.
                          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   + 8;
        puVar3 = (undefined1 *)
                 ((long)&a.val.
                         super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 + 8);
        if (local_1b0 == (undefined1  [8])puVar3) {
          _val.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_u._16_8_ = a.val.
                         super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         ._M_u._16_8_;
        }
        else {
          a.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._104_8_ = local_1b0;
        }
        _val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._9_7_ = a.val.
                      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      ._M_u._9_7_;
        _val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._M_first._M_storage._M_storage[8] =
             a.val.
             super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             ._M_u._M_first._M_storage._M_storage[8];
        _val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._0_8_ = a.val.
                      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      ._M_u._0_8_;
        a.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._0_8_ = 0;
        a.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._M_first._M_storage._M_storage[8] = '\0';
        _val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_index = '\x02';
        local_1b0 = (undefined1  [8])puVar3;
        if (local_240 != (undefined1  [8])pvVar1) {
          operator_delete((void *)local_240,
                          c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                          super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._8_8_ + 1);
        }
      }
    }
    std::__detail::__variant::
    _Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         *)&lanes.
                            super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    _val.val.
    super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    ._M_index = '\x01';
  }
  _Var7 = _val.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_index;
  if (_val.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_index == '\x01') {
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err> *)
               ((long)&a.val.
                       super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               + 0x68));
  }
  else {
    std::__detail::__variant::
    _Copy_ctor_base<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>::_Copy_ctor_base
              ((_Copy_ctor_base<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err> *)
               &lanes.
                super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (_Copy_ctor_base<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err> *)
               ((long)&a.val.
                       super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               + 0x68));
    if (a_2.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_index == '\x02') {
      puVar3 = (undefined1 *)
               ((long)&a.val.
                       super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               + 8);
      local_1b0 = (undefined1  [8])puVar3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1b0,
                 lanes.
                 super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (long)&((lanes.
                          super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                        super__Variant_base<wasm::Literal,_wasm::WATParser::NaNResult>).
                        super__Move_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
                        super__Copy_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
                        super__Move_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
                        super__Copy_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
                        super__Variant_storage_alias<wasm::Literal,_wasm::WATParser::NaNResult>._M_u
                 + a_2.val.
                   super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   ._M_u._0_8_);
      *(undefined8 **)
       _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
       super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
       super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
       super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
       super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
       super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ =
           (undefined8 *)
           (_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ + 0x10);
      if (local_1b0 == (undefined1  [8])puVar3) {
        *(undefined8 *)
         (_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ + 0x10) =
             CONCAT71(a.val.
                      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      ._M_u._9_7_,
                      a.val.
                      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      ._M_u._M_first._M_storage._M_storage[8]);
        *(undefined8 *)
         (_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ + 0x18) =
             a.val.
             super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             ._M_u._16_8_;
      }
      else {
        *(undefined1 (*) [8])
         _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
         super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
         super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
         super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
         super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
         super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ = local_1b0;
        *(ulong *)(_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ + 0x10)
             = CONCAT71(a.val.
                        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        ._M_u._9_7_,
                        a.val.
                        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        ._M_u._M_first._M_storage._M_storage[8]);
      }
      *(undefined8 *)
       (_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ + 8) =
           a.val.
           super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
           .
           super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
           .
           super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
           .
           super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
           .
           super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
           .
           super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
           ._M_u._0_8_;
      a.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_u._0_8_ = 0;
      a.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_u._M_first._M_storage._M_storage[8] = '\0';
      *(undefined1 *)
       (_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ + 0x88) = 2;
      local_1b0 = (undefined1  [8])puVar3;
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                         *)&lanes.
                            super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    else {
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                         *)&lanes.
                            super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      lanes.
      super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)CONCAT44(lanes.
                             super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                             a.val.
                             super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             .
                             super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             .
                             super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             .
                             super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             .
                             super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             .
                             super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             ._104_4_);
      pRVar11 = (Result<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_> *)
                &DAT_00000008;
      if (_val.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_index == '\0') {
        pRVar11 = &_val;
      }
      std::__detail::__variant::
      _Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>::
      _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                       *)&a_2,(_Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                               *)pRVar11);
      uVar10 = _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
               super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
               super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
               super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
               super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
               super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_;
      std::__detail::__variant::
      _Move_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
      ::_Move_ctor_base((_Move_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                         *)_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_,
                        (_Move_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                         *)&lanes.
                            super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      *(undefined1 *)(uVar10 + 0x88) = 0;
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
      ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                           *)&lanes.
                              super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err> *)
               ((long)&a.val.
                       super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               + 0x68));
    if (_Var7 != '\x01') {
      return (MaybeResult<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
              *)_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_;
    }
  }
  expected_13._M_str = "assert_exhaustion";
  expected_13._M_len = 0x11;
  bVar8 = Lexer::takeSExprStart(in,expected_13);
  if (bVar8) {
    ppvVar4 = &lanes.
               super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    action((Result<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_> *)
           ppvVar4,in);
    std::__detail::__variant::
    _Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       *)local_1b0,
                      (_Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       *)ppvVar4);
    if (a.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._M_first._M_storage._M_storage[0x60] == '\x01') {
      pvVar1 = (variant<wasm::Literal,_wasm::WATParser::NaNResult> *)
               ((long)&c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                       super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 8);
      local_240 = (undefined1  [8])pvVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_240,local_1b0,
                 (undefined1 *)
                 (a.val.
                  super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  ._M_u._0_8_ + (long)local_1b0));
      a.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._104_8_ = (long)&_val.val.
                        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 + 8;
      if (local_240 == (undefined1  [8])pvVar1) {
        _val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._16_8_ = c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                       super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._16_8_;
      }
      else {
        a.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._104_8_ = local_240;
      }
      _val.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_u._8_8_ = c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                    super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._8_8_;
      _val.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_u._0_8_ = c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                    super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._0_8_;
      _val.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_index = '\x02';
      std::__detail::__variant::
      _Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           *)local_1b0);
    }
    else {
      std::__detail::__variant::
      _Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           *)local_1b0);
      Lexer::takeString_abi_cxx11_
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_240,in);
      if (c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
          super__Move_assign_alias<wasm::Literal,_wasm::Err>.
          super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
          super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
          super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._24_1_ == '\0') {
        local_80 = (undefined1  [8])
                   ((long)&kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 8);
        local_b0 = (undefined1  [8])0x16;
        local_80 = (undefined1  [8])
                   std::__cxx11::string::_M_create((ulong *)local_80,(ulong)local_b0);
        kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_ = local_b0;
        *(undefined8 *)
         &(((variant<wasm::Literal,_wasm::WATParser::NaNResult> *)local_80)->
          super__Variant_base<wasm::Literal,_wasm::WATParser::NaNResult>).
          super__Move_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
          super__Copy_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
          super__Move_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
          super__Copy_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
          super__Variant_storage_alias<wasm::Literal,_wasm::WATParser::NaNResult>._M_u =
             0x6465746365707865;
        builtin_strncpy((char *)((long)&(((variant<wasm::Literal,_wasm::WATParser::NaNResult> *)
                                         local_80)->
                                        super__Variant_base<wasm::Literal,_wasm::WATParser::NaNResult>
                                        ).
                                        super__Move_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>
                                        .
                                        super__Copy_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>
                                        .
                                        super__Move_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>
                                        .
                                        super__Copy_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>
                                        .
                                        super__Variant_storage_alias<wasm::Literal,_wasm::WATParser::NaNResult>
                                        ._M_u + 8)," error m",8);
        *(undefined8 *)
         ((long)&(((variant<wasm::Literal,_wasm::WATParser::NaNResult> *)local_80)->
                 super__Variant_base<wasm::Literal,_wasm::WATParser::NaNResult>).
                 super__Move_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
                 super__Copy_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
                 super__Move_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
                 super__Copy_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
                 super__Variant_storage_alias<wasm::Literal,_wasm::WATParser::NaNResult>._M_u + 0xe)
             = 0x6567617373656d20;
        kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._0_8_ = local_b0;
        *(undefined1 *)
         ((long)&(((variant<wasm::Literal,_wasm::WATParser::NaNResult> *)local_80)->
                 super__Variant_base<wasm::Literal,_wasm::WATParser::NaNResult>).
                 super__Move_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
                 super__Copy_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
                 super__Move_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
                 super__Copy_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
                 super__Variant_storage_alias<wasm::Literal,_wasm::WATParser::NaNResult>._M_u +
         (long)local_b0) = 0;
        Lexer::err((Err *)local_1b0,in,(string *)local_80);
LAB_00c301f8:
        a.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._104_8_ = (long)&_val.val.
                          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   + 8;
        puVar3 = (undefined1 *)
                 ((long)&a.val.
                         super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 + 8);
        if (local_1b0 == (undefined1  [8])puVar3) {
          _val.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_u._16_8_ = a.val.
                         super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         ._M_u._16_8_;
        }
        else {
          a.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._104_8_ = local_1b0;
        }
        _val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._9_7_ = a.val.
                      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      ._M_u._9_7_;
        _val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._M_first._M_storage._M_storage[8] =
             a.val.
             super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             ._M_u._M_first._M_storage._M_storage[8];
        _val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._0_8_ = a.val.
                      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      ._M_u._0_8_;
        a.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._0_8_ = 0;
        a.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._M_first._M_storage._M_storage[8] = '\0';
        _val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_index = '\x02';
        local_1b0 = (undefined1  [8])puVar3;
        if (local_80 !=
            (undefined1  [8])
            ((long)&kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 8U)) {
          operator_delete((void *)local_80,
                          kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u.
                          _8_8_ + 1);
        }
      }
      else {
        bVar8 = Lexer::takeRParen(in);
        if (!bVar8) {
          local_80 = (undefined1  [8])
                     ((long)&kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_80,"expected end of assertion","");
          Lexer::err((Err *)local_1b0,in,(string *)local_80);
          goto LAB_00c301f8;
        }
        local_1b0._0_4_ = 1;
        ppvVar12 = (pointer *)0x0;
        if (a_2.val.
            super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            ._M_u._M_first._M_storage._M_storage[0x60] == '\0') {
          ppvVar12 = ppvVar4;
        }
        std::__detail::__variant::
        _Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>::
        _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                         *)&a,(_Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                               *)ppvVar12);
        a.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._104_4_ = local_1b0._0_4_;
        std::__detail::__variant::
        _Move_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>::
        _Move_ctor_base((_Move_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                         *)&_val,(_Move_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                                  *)&a);
        _val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._104_8_ = _val.val.
                   super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   ._104_8_ & 0xffffffffffffff00;
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                           *)&a);
      }
      if ((c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
           super__Move_assign_alias<wasm::Literal,_wasm::Err>.
           super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
           super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
           super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._24_1_ == '\x01') &&
         (c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
          super__Move_assign_alias<wasm::Literal,_wasm::Err>.
          super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
          super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
          super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._24_1_ = 0,
         local_240 !=
         (undefined1  [8])
         ((long)&c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                 super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 8U))) {
        operator_delete((void *)local_240,
                        c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                        super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._8_8_ + 1);
      }
    }
    std::__detail::__variant::
    _Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         *)&lanes.
                            super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    _val.val.
    super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    ._M_index = '\x01';
  }
  _Var7 = _val.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_index;
  if (_val.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_index == '\x01') {
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err> *)
               ((long)&a.val.
                       super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               + 0x68));
  }
  else {
    std::__detail::__variant::
    _Copy_ctor_base<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>::_Copy_ctor_base
              ((_Copy_ctor_base<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err> *)
               &lanes.
                super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (_Copy_ctor_base<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err> *)
               ((long)&a.val.
                       super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               + 0x68));
    if (a_2.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_index == '\x02') {
      puVar3 = (undefined1 *)
               ((long)&a.val.
                       super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               + 8);
      local_1b0 = (undefined1  [8])puVar3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1b0,
                 lanes.
                 super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (long)&((lanes.
                          super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                        super__Variant_base<wasm::Literal,_wasm::WATParser::NaNResult>).
                        super__Move_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
                        super__Copy_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
                        super__Move_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
                        super__Copy_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
                        super__Variant_storage_alias<wasm::Literal,_wasm::WATParser::NaNResult>._M_u
                 + a_2.val.
                   super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   ._M_u._0_8_);
      *(undefined8 **)
       _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
       super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
       super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
       super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
       super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
       super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ =
           (undefined8 *)
           (_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ + 0x10);
      if (local_1b0 == (undefined1  [8])puVar3) {
        *(undefined8 *)
         (_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ + 0x10) =
             CONCAT71(a.val.
                      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      ._M_u._9_7_,
                      a.val.
                      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      ._M_u._M_first._M_storage._M_storage[8]);
        *(undefined8 *)
         (_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ + 0x18) =
             a.val.
             super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             ._M_u._16_8_;
      }
      else {
        *(undefined1 (*) [8])
         _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
         super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
         super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
         super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
         super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
         super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ = local_1b0;
        *(ulong *)(_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ + 0x10)
             = CONCAT71(a.val.
                        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        ._M_u._9_7_,
                        a.val.
                        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        ._M_u._M_first._M_storage._M_storage[8]);
      }
      *(undefined8 *)
       (_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ + 8) =
           a.val.
           super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
           .
           super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
           .
           super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
           .
           super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
           .
           super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
           .
           super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
           ._M_u._0_8_;
      a.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_u._0_8_ = 0;
      a.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_u._M_first._M_storage._M_storage[8] = '\0';
      *(undefined1 *)
       (_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ + 0x88) = 2;
      local_1b0 = (undefined1  [8])puVar3;
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                         *)&lanes.
                            super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    else {
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                         *)&lanes.
                            super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      lanes.
      super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)CONCAT44(lanes.
                             super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                             a.val.
                             super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             .
                             super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             .
                             super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             .
                             super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             .
                             super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             .
                             super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             ._104_4_);
      pRVar11 = (Result<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_> *)
                &DAT_00000008;
      if (_val.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_index == '\0') {
        pRVar11 = &_val;
      }
      std::__detail::__variant::
      _Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>::
      _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                       *)&a_2,(_Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                               *)pRVar11);
      uVar10 = _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
               super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
               super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
               super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
               super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
               super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_;
      std::__detail::__variant::
      _Move_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
      ::_Move_ctor_base((_Move_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                         *)_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_,
                        (_Move_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                         *)&lanes.
                            super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      *(undefined1 *)(uVar10 + 0x88) = 0;
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
      ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                           *)&lanes.
                              super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err> *)
               ((long)&a.val.
                       super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               + 0x68));
    if (_Var7 != '\x01') {
      return (MaybeResult<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
              *)_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_;
    }
  }
  expected_14._M_str = "assert_malformed";
  expected_14._M_len = 0x10;
  bVar8 = Lexer::takeSExprStart(in,expected_14);
  if (bVar8) {
    uVar15 = 1;
LAB_00c30408:
    bVar8 = false;
LAB_00c30430:
    ppvVar4 = &lanes.
               super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    wastModule((Result<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>_>
                *)ppvVar4,in,bVar8);
    std::__detail::__variant::
    _Copy_ctor_base<false,_std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                       *)local_1b0,
                      (_Copy_ctor_base<false,_std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                       *)ppvVar4);
    if (a.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._M_first._M_storage._M_storage[0x28] == '\x01') {
      pvVar1 = (variant<wasm::Literal,_wasm::WATParser::NaNResult> *)
               ((long)&c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                       super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 8);
      local_240 = (undefined1  [8])pvVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_240,local_1b0,
                 (undefined1 *)
                 (a.val.
                  super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  ._M_u._0_8_ + (long)local_1b0));
      a.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._104_8_ = (long)&_val.val.
                        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 + 8;
      if (local_240 == (undefined1  [8])pvVar1) {
        _val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._16_8_ = c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                       super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._16_8_;
      }
      else {
        a.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._104_8_ = local_240;
      }
      _val.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_u._8_8_ = c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                    super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._8_8_;
      _val.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_u._0_8_ = c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                    super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._0_8_;
      _val.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_u._M_first._M_storage._M_storage[0x30] = '\x02';
      std::__detail::__variant::
      _Variant_storage<false,_std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                           *)local_1b0);
    }
    else {
      std::__detail::__variant::
      _Variant_storage<false,_std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                           *)local_1b0);
      Lexer::takeString_abi_cxx11_
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_240,in);
      if (c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
          super__Move_assign_alias<wasm::Literal,_wasm::Err>.
          super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
          super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
          super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._24_1_ == '\0') {
        local_80 = (undefined1  [8])
                   ((long)&kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 8);
        local_b0 = (undefined1  [8])0x16;
        local_80 = (undefined1  [8])
                   std::__cxx11::string::_M_create((ulong *)local_80,(ulong)local_b0);
        kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_ = local_b0;
        *(undefined8 *)
         &(((variant<wasm::Literal,_wasm::WATParser::NaNResult> *)local_80)->
          super__Variant_base<wasm::Literal,_wasm::WATParser::NaNResult>).
          super__Move_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
          super__Copy_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
          super__Move_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
          super__Copy_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
          super__Variant_storage_alias<wasm::Literal,_wasm::WATParser::NaNResult>._M_u =
             0x6465746365707865;
        builtin_strncpy((char *)((long)&(((variant<wasm::Literal,_wasm::WATParser::NaNResult> *)
                                         local_80)->
                                        super__Variant_base<wasm::Literal,_wasm::WATParser::NaNResult>
                                        ).
                                        super__Move_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>
                                        .
                                        super__Copy_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>
                                        .
                                        super__Move_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>
                                        .
                                        super__Copy_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>
                                        .
                                        super__Variant_storage_alias<wasm::Literal,_wasm::WATParser::NaNResult>
                                        ._M_u + 8)," error m",8);
        *(undefined8 *)
         ((long)&(((variant<wasm::Literal,_wasm::WATParser::NaNResult> *)local_80)->
                 super__Variant_base<wasm::Literal,_wasm::WATParser::NaNResult>).
                 super__Move_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
                 super__Copy_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
                 super__Move_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
                 super__Copy_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
                 super__Variant_storage_alias<wasm::Literal,_wasm::WATParser::NaNResult>._M_u + 0xe)
             = 0x6567617373656d20;
        kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._0_8_ = local_b0;
        *(undefined1 *)
         ((long)&(((variant<wasm::Literal,_wasm::WATParser::NaNResult> *)local_80)->
                 super__Variant_base<wasm::Literal,_wasm::WATParser::NaNResult>).
                 super__Move_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
                 super__Copy_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
                 super__Move_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
                 super__Copy_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
                 super__Variant_storage_alias<wasm::Literal,_wasm::WATParser::NaNResult>._M_u +
         (long)local_b0) = 0;
        Lexer::err((Err *)local_1b0,in,(string *)local_80);
LAB_00c30636:
        a.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._104_8_ = (long)&_val.val.
                          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   + 8;
        puVar3 = (undefined1 *)
                 ((long)&a.val.
                         super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 + 8);
        if (local_1b0 == (undefined1  [8])puVar3) {
          _val.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_u._16_8_ = a.val.
                         super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         ._M_u._16_8_;
        }
        else {
          a.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._104_8_ = local_1b0;
        }
        _val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._9_7_ = a.val.
                      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      ._M_u._9_7_;
        _val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._M_first._M_storage._M_storage[8] =
             a.val.
             super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             ._M_u._M_first._M_storage._M_storage[8];
        _val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._0_8_ = a.val.
                      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      ._M_u._0_8_;
        a.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._0_8_ = 0;
        a.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._M_first._M_storage._M_storage[8] = '\0';
        _val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._M_first._M_storage._M_storage[0x30] = '\x02';
        local_1b0 = (undefined1  [8])puVar3;
        if (local_80 !=
            (undefined1  [8])
            ((long)&kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 8U)) {
          operator_delete((void *)local_80,
                          kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u.
                          _8_8_ + 1);
        }
      }
      else {
        bVar8 = Lexer::takeRParen(in);
        if (!bVar8) {
          local_80 = (undefined1  [8])
                     ((long)&kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_80,"expected end of assertion","");
          Lexer::err((Err *)local_1b0,in,(string *)local_80);
          goto LAB_00c30636;
        }
        local_1b0._0_4_ = uVar15;
        ppvVar12 = (pointer *)0x0;
        if (a_2.val.
            super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            ._M_u._M_first._M_storage._M_storage[0x28] == '\0') {
          ppvVar12 = ppvVar4;
        }
        std::__detail::__variant::
        _Copy_ctor_base<false,_wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>::
        _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                         *)&a,(_Copy_ctor_base<false,_wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                               *)ppvVar12);
        a.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._104_4_ = local_1b0._0_4_;
        std::__detail::__variant::
        _Move_ctor_base<false,_wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>::
        _Move_ctor_base((_Move_ctor_base<false,_wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                         *)&_val,(_Move_ctor_base<false,_wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                                  *)&a);
        _val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._M_first._M_storage._M_storage[0x30] = '\0';
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                           *)&a);
      }
      if ((c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
           super__Move_assign_alias<wasm::Literal,_wasm::Err>.
           super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
           super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
           super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._24_1_ == '\x01') &&
         (c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
          super__Move_assign_alias<wasm::Literal,_wasm::Err>.
          super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
          super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
          super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._24_1_ = 0,
         local_240 !=
         (undefined1  [8])
         ((long)&c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                 super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 8U))) {
        operator_delete((void *)local_240,
                        c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                        super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._8_8_ + 1);
      }
    }
    std::__detail::__variant::
    _Variant_storage<false,_std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                         *)&lanes.
                            super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    expected_15._M_str = "assert_invalid";
    expected_15._M_len = 0xe;
    bVar8 = Lexer::takeSExprStart(in,expected_15);
    if (bVar8) {
      uVar15 = 2;
      bVar8 = true;
      goto LAB_00c30430;
    }
    expected_16._M_str = "assert_unlinkable";
    expected_16._M_len = 0x11;
    bVar8 = Lexer::takeSExprStart(in,expected_16);
    if (bVar8) {
      uVar15 = 3;
      goto LAB_00c30408;
    }
    _val.val.
    super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    ._M_u._M_first._M_storage._M_storage[0x30] = '\x01';
  }
  uVar6 = _val.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_u._M_first._M_storage._M_storage[0x30];
  if (_val.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_u._M_first._M_storage._M_storage[0x30] == '\x01') {
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::WATParser::AssertModule,_wasm::None,_wasm::Err> *)
               ((long)&a.val.
                       super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               + 0x68));
  }
  else {
    std::__detail::__variant::
    _Copy_ctor_base<false,_wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>::_Copy_ctor_base
              ((_Copy_ctor_base<false,_wasm::WATParser::AssertModule,_wasm::None,_wasm::Err> *)
               &lanes.
                super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (_Copy_ctor_base<false,_wasm::WATParser::AssertModule,_wasm::None,_wasm::Err> *)
               ((long)&a.val.
                       super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               + 0x68));
    if (a_2.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._M_first._M_storage._M_storage[0x30] == '\x02') {
      puVar3 = (undefined1 *)
               ((long)&a.val.
                       super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               + 8);
      local_1b0 = (undefined1  [8])puVar3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1b0,
                 lanes.
                 super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (long)&((lanes.
                          super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                        super__Variant_base<wasm::Literal,_wasm::WATParser::NaNResult>).
                        super__Move_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
                        super__Copy_assign_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
                        super__Move_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
                        super__Copy_ctor_alias<wasm::Literal,_wasm::WATParser::NaNResult>.
                        super__Variant_storage_alias<wasm::Literal,_wasm::WATParser::NaNResult>._M_u
                 + a_2.val.
                   super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   .
                   super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                   ._M_u._0_8_);
      *(undefined8 **)
       _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
       super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
       super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
       super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
       super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
       super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ =
           (undefined8 *)
           (_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ + 0x10);
      if (local_1b0 == (undefined1  [8])puVar3) {
        *(undefined8 *)
         (_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ + 0x10) =
             CONCAT71(a.val.
                      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      ._M_u._9_7_,
                      a.val.
                      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      ._M_u._M_first._M_storage._M_storage[8]);
        *(undefined8 *)
         (_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ + 0x18) =
             a.val.
             super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             ._M_u._16_8_;
      }
      else {
        *(undefined1 (*) [8])
         _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
         super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
         super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
         super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
         super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
         super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ = local_1b0;
        *(ulong *)(_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ + 0x10)
             = CONCAT71(a.val.
                        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        ._M_u._9_7_,
                        a.val.
                        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        ._M_u._M_first._M_storage._M_storage[8]);
      }
      *(undefined8 *)
       (_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ + 8) =
           a.val.
           super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
           .
           super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
           .
           super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
           .
           super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
           .
           super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
           .
           super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
           ._M_u._0_8_;
      a.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_u._0_8_ = 0;
      a.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_u._M_first._M_storage._M_storage[8] = '\0';
      *(undefined1 *)
       (_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ + 0x88) = 2;
      local_1b0 = (undefined1  [8])puVar3;
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>
                         *)&lanes.
                            super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    else {
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>
                         *)&lanes.
                            super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      lanes.
      super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)CONCAT44(lanes.
                             super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                             a.val.
                             super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             .
                             super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             .
                             super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             .
                             super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             .
                             super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             .
                             super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             ._104_4_);
      pRVar11 = (Result<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_> *)
                &DAT_00000008;
      if (_val.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_u._M_first._M_storage._M_storage[0x30] == '\0') {
        pRVar11 = &_val;
      }
      std::__detail::__variant::
      _Copy_ctor_base<false,_wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>::
      _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                       *)&a_2,(_Copy_ctor_base<false,_wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                               *)pRVar11);
      uVar10 = _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
               super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
               super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
               super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
               super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
               super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_;
      std::__detail::__variant::
      _Move_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
      ::_Move_ctor_base((_Move_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                         *)_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_,
                        (_Move_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                         *)&lanes.
                            super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      *(undefined1 *)(uVar10 + 0x88) = 0;
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
      ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                           *)&lanes.
                              super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::WATParser::AssertModule,_wasm::None,_wasm::Err> *)
               ((long)&a.val.
                       super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               + 0x68));
    if (uVar6 != '\x01') {
      return (MaybeResult<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
              *)_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_;
    }
  }
  expected_17._M_str = "assert_trap";
  expected_17._M_len = 0xb;
  bVar8 = Lexer::takeSExprStart(in,expected_17);
  if (!bVar8) {
    local_248 = '\x01';
    goto LAB_00c30da6;
  }
  pos = in->pos;
  maybeAction((MaybeResult<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_>
               *)local_1b0,in);
  if (a.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_u._M_first._M_storage._M_storage[0x60] != '\x01') {
    std::__detail::__variant::
    _Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       *)((long)&a.val.
                                 super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                 .
                                 super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                 .
                                 super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                 .
                                 super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                 .
                                 super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         + 0x68),
                      (_Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       *)local_1b0);
    if (_val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._M_first._M_storage._M_storage[0x60] == '\x02') {
      pvVar1 = (variant<wasm::Literal,_wasm::WATParser::NaNResult> *)
               ((long)&c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                       super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 8);
      local_240 = (undefined1  [8])pvVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_240,
                 a.val.
                 super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 .
                 super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 .
                 super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 .
                 super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 .
                 super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 .
                 super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 ._104_8_,_val.val.
                          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          ._M_u._0_8_ +
                          a.val.
                          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          ._104_8_);
      lanes.
      super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)&a_2.val.
                            super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                            .
                            super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                            .
                            super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                            .
                            super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                            .
                            super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    + 8);
      if (local_240 == (undefined1  [8])pvVar1) {
        a_2.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._16_8_ = c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                       super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._16_8_;
      }
      else {
        lanes.
        super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_240;
      }
      a_2.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_u._8_8_ = c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                    super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._8_8_;
      a_2.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_u._0_8_ = c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                    super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._0_8_;
      local_248 = '\x02';
      std::__detail::__variant::
      _Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                           *)((long)&a.val.
                                     super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                     .
                                     super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                     .
                                     super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                     .
                                     super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                     .
                                     super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             + 0x68));
    }
    else {
      std::__detail::__variant::
      _Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                           *)((long)&a.val.
                                     super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                     .
                                     super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                     .
                                     super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                     .
                                     super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                     .
                                     super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             + 0x68));
      Lexer::takeString_abi_cxx11_
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_80,in);
      if (kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._24_1_ == '\0') {
        local_240 = (undefined1  [8])
                    ((long)&c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                            super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_240,"expected error message","");
        Lexer::err((Err *)((long)&a.val.
                                  super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                  .
                                  super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                  .
                                  super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                  .
                                  super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                  .
                                  super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          + 0x68),in,(string *)local_240);
LAB_00c30cf6:
        lanes.
        super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)((long)&a_2.val.
                              super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              .
                              super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              .
                              super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              .
                              super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              .
                              super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      + 8);
        puVar3 = (undefined1 *)
                 ((long)&_val.val.
                         super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 + 8);
        if ((undefined1 *)
            a.val.
            super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            ._104_8_ == puVar3) {
          a_2.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_u._16_8_ = _val.val.
                         super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         .
                         super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         ._M_u._16_8_;
        }
        else {
          lanes.
          super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)a.val.
                        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        ._104_8_;
        }
        a_2.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._8_8_ = _val.val.
                      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      ._M_u._8_8_;
        a_2.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._0_8_ = _val.val.
                      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      ._M_u._0_8_;
        _val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._0_8_ = 0;
        _val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._8_8_ = _val.val.
                      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      ._M_u._8_8_ & 0xffffffffffffff00;
        local_248 = '\x02';
        a.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._104_8_ = puVar3;
        if (local_240 !=
            (undefined1  [8])
            ((long)&c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                    super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 8U)) {
          operator_delete((void *)local_240,
                          c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                          super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._8_8_ + 1);
        }
      }
      else {
        bVar8 = Lexer::takeRParen(in);
        if (!bVar8) {
          local_240 = (undefined1  [8])
                      ((long)&c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                              super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_240,"expected end of assertion","");
          Lexer::err((Err *)((long)&a.val.
                                    super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                    .
                                    super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                    .
                                    super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                    .
                                    super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                    .
                                    super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                            + 0x68),in,(string *)local_240);
          goto LAB_00c30cf6;
        }
        local_240 = (undefined1  [8])((ulong)local_240 & 0xffffffff00000000);
        __rhs_01 = (_Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                    *)0x0;
        if (a.val.
            super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            ._M_u._M_first._M_storage._M_storage[0x60] == '\0') {
          __rhs_01 = (_Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                      *)local_1b0;
        }
        std::__detail::__variant::
        _Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>::
        _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                         *)&c,(_Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                               *)__rhs_01);
        a.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._104_4_ = local_240._0_4_;
        std::__detail::__variant::
        _Move_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>::
        _Move_ctor_base((_Move_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                         *)&_val,(_Move_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                                  *)&c);
        std::__detail::__variant::
        _Move_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
        ::_Move_ctor_base((_Move_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                           *)&lanes.
                              super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (_Move_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                           *)((long)&a.val.
                                     super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                     .
                                     super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                     .
                                     super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                     .
                                     super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                     .
                                     super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             + 0x68));
        local_248 = '\0';
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
        ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                             *)((long)&a.val.
                                       super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                       .
                                       super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                       .
                                       super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                       .
                                       super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                       .
                                       super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                               + 0x68));
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                           *)&c);
      }
      if ((kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
           super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
           super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
           super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
           super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
           super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._24_1_ == '\x01')
         && (kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
             super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
             super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
             super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
             super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
             super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._24_1_ = 0,
            local_80 !=
            (undefined1  [8])
            ((long)&kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 8U))) {
        operator_delete((void *)local_80,
                        kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_
                        + 1);
      }
    }
    std::__detail::__variant::
    _Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                         *)local_1b0);
    goto LAB_00c30da6;
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
  ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       *)local_1b0);
  wastModule((Result<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>_> *
             )local_1b0,in,false);
  if (a.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_u._M_first._M_storage._M_storage[0x28] == '\x01') {
    pvVar1 = (variant<wasm::Literal,_wasm::WATParser::NaNResult> *)
             ((long)&c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                     super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 8);
    local_240 = (undefined1  [8])pvVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_240,"expected action or module","");
    Lexer::err((Err *)((long)&a.val.
                              super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              .
                              super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              .
                              super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              .
                              super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              .
                              super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      + 0x68),in,pos,(string *)local_240);
    lanes.
    super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)&a_2.val.
                          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  + 8);
    puVar3 = (undefined1 *)
             ((long)&_val.val.
                     super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             + 8);
    if ((undefined1 *)
        a.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._104_8_ == puVar3) {
      a_2.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_u._16_8_ = _val.val.
                     super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     ._M_u._16_8_;
    }
    else {
      lanes.
      super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)a.val.
                    super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    ._104_8_;
    }
    a_2.val.
    super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    ._M_u._8_8_ = _val.val.
                  super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  ._M_u._8_8_;
    a_2.val.
    super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    ._M_u._0_8_ = _val.val.
                  super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  ._M_u._0_8_;
    _val.val.
    super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    ._M_u._0_8_ = 0;
    _val.val.
    super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    ._M_u._8_8_ = _val.val.
                  super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  .
                  super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  ._M_u._8_8_ & 0xffffffffffffff00;
    local_248 = '\x02';
    uVar10 = c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
             super__Move_assign_alias<wasm::Literal,_wasm::Err>.
             super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
             super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
             super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._8_8_;
    auVar14 = local_240;
    a.val.
    super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    ._104_8_ = puVar3;
    if (local_240 != (undefined1  [8])pvVar1) {
LAB_00c30ca2:
      operator_delete((void *)auVar14,uVar10 + 1);
    }
  }
  else {
    Lexer::takeString_abi_cxx11_
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_80,in);
    if (kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._24_1_ == '\0') {
      local_240 = (undefined1  [8])
                  ((long)&c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                          super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_240,"expected error message","");
      Lexer::err((Err *)((long)&a.val.
                                super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                .
                                super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                .
                                super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                .
                                super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                .
                                super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        + 0x68),in,(string *)local_240);
LAB_00c30c06:
      lanes.
      super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)&a_2.val.
                            super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                            .
                            super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                            .
                            super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                            .
                            super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                            .
                            super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    + 8);
      puVar3 = (undefined1 *)
               ((long)&_val.val.
                       super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               + 8);
      if ((undefined1 *)
          a.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._104_8_ == puVar3) {
        a_2.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._16_8_ = _val.val.
                       super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       ._M_u._16_8_;
      }
      else {
        lanes.
        super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)a.val.
                      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      ._104_8_;
      }
      a_2.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_u._8_8_ = _val.val.
                    super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    ._M_u._8_8_;
      a_2.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_u._0_8_ = _val.val.
                    super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    ._M_u._0_8_;
      _val.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_u._0_8_ = 0;
      _val.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_u._8_8_ = _val.val.
                    super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    .
                    super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    ._M_u._8_8_ & 0xffffffffffffff00;
      local_248 = '\x02';
      a.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._104_8_ = puVar3;
      if (local_240 !=
          (undefined1  [8])
          ((long)&c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                  super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 8U)) {
        operator_delete((void *)local_240,
                        c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                        super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._8_8_ + 1);
      }
    }
    else {
      bVar8 = Lexer::takeRParen(in);
      if (!bVar8) {
        local_240 = (undefined1  [8])
                    ((long)&c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                            super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_240,"expected end of assertion","");
        Lexer::err((Err *)((long)&a.val.
                                  super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                  .
                                  super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                  .
                                  super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                  .
                                  super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                  .
                                  super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          + 0x68),in,(string *)local_240);
        goto LAB_00c30c06;
      }
      local_240 = (undefined1  [8])((ulong)local_240 & 0xffffffff00000000);
      __rhs_00 = (MaybeResult<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_>
                  *)0x0;
      if (a.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_u._M_first._M_storage._M_storage[0x28] == '\0') {
        __rhs_00 = (MaybeResult<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_>
                    *)local_1b0;
      }
      std::__detail::__variant::
      _Copy_ctor_base<false,_wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>::
      _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                       *)&c,(_Copy_ctor_base<false,_wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                             *)__rhs_00);
      a.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._104_4_ = local_240._0_4_;
      std::__detail::__variant::
      _Move_ctor_base<false,_wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>::
      _Move_ctor_base((_Move_ctor_base<false,_wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                       *)&_val,(_Move_ctor_base<false,_wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                                *)&c);
      std::__detail::__variant::
      _Move_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
      ::_Move_ctor_base((_Move_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                         *)&lanes.
                            super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        (_Move_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                         *)((long)&a.val.
                                   super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                   .
                                   super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                   .
                                   super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                   .
                                   super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                   .
                                   super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           + 0x68));
      local_248 = '\0';
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
      ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                           *)((long)&a.val.
                                     super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                     .
                                     super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                     .
                                     super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                     .
                                     super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                     .
                                     super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             + 0x68));
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                         *)&c);
    }
    if ((kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
         super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
         super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
         super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
         super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
         super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._24_1_ == '\x01') &&
       (kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._24_1_ = 0,
       uVar10 = kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_,
       auVar14 = local_80,
       local_80 !=
       (undefined1  [8])
       ((long)&kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
               super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
               super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
               super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
               super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 8U)))
    goto LAB_00c30ca2;
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
  ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                       *)local_1b0);
LAB_00c30da6:
  if (local_248 == '\x01') {
    std::__detail::__variant::
    _Variant_storage<false,_std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                         *)&lanes.
                            super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    ppvVar4 = &lanes.
               super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::__detail::__variant::
    _Copy_ctor_base<false,_std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                       *)((long)&a.val.
                                 super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                 .
                                 super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                 .
                                 super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                 .
                                 super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                 .
                                 super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         + 0x68),
                      (_Copy_ctor_base<false,_std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                       *)ppvVar4);
    if (local_b8 == '\x02') {
      puVar3 = (undefined1 *)
               ((long)&a.val.
                       super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               + 8);
      local_1b0 = (undefined1  [8])puVar3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1b0,
                 a.val.
                 super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 .
                 super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 .
                 super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 .
                 super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 .
                 super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 .
                 super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 ._104_8_,_val.val.
                          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          ._M_u._0_8_ +
                          a.val.
                          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          .
                          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                          ._104_8_);
      *(undefined8 **)
       _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
       super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
       super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
       super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
       super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
       super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ =
           (undefined8 *)
           (_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ + 0x10);
      if (local_1b0 == (undefined1  [8])puVar3) {
        *(undefined8 *)
         (_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ + 0x10) =
             CONCAT71(a.val.
                      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      ._M_u._9_7_,
                      a.val.
                      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      .
                      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      ._M_u._M_first._M_storage._M_storage[8]);
        *(undefined8 *)
         (_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ + 0x18) =
             a.val.
             super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             ._M_u._16_8_;
      }
      else {
        *(undefined1 (*) [8])
         _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
         super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
         super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
         super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
         super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
         super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ = local_1b0;
        *(ulong *)(_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                   super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ + 0x10)
             = CONCAT71(a.val.
                        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        ._M_u._9_7_,
                        a.val.
                        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        ._M_u._M_first._M_storage._M_storage[8]);
      }
      *(undefined8 *)
       (_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ + 8) =
           a.val.
           super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
           .
           super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
           .
           super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
           .
           super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
           .
           super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
           .
           super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
           ._M_u._0_8_;
      a.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_u._0_8_ = 0;
      a.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_u._M_first._M_storage._M_storage[8] = '\0';
      *(undefined1 *)
       (_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ + 0x88) = 2;
      local_1b0 = (undefined1  [8])puVar3;
      std::__detail::__variant::
      _Variant_storage<false,_std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                           *)((long)&a.val.
                                     super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                     .
                                     super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                     .
                                     super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                     .
                                     super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                     .
                                     super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             + 0x68));
    }
    else {
      std::__detail::__variant::
      _Variant_storage<false,_std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                           *)((long)&a.val.
                                     super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                     .
                                     super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                     .
                                     super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                     .
                                     super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                     .
                                     super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             + 0x68));
      uVar10 = _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
               super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
               super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
               super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
               super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
               super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_;
      ppvVar12 = (pointer *)0x0;
      if (local_248 == '\0') {
        ppvVar12 = ppvVar4;
      }
      std::__detail::__variant::
      _Copy_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
      ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                         *)_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_,
                        (_Copy_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                         *)ppvVar12);
      *(undefined1 *)(uVar10 + 0x88) = 0;
    }
    std::__detail::__variant::
    _Variant_storage<false,_std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                         *)&lanes.
                            super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (local_248 != '\x01') {
      return (MaybeResult<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
              *)_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_;
    }
  }
  *(undefined1 *)
   (_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
    super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
    super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
    super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
    super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
    super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ + 0x88) = 1;
  return (MaybeResult<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
          *)_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_;
}

Assistant:

MaybeResult<Assertion> assertion(Lexer& in) {
  if (auto a = assertReturn(in)) {
    CHECK_ERR(a);
    return Assertion{*a};
  }
  if (auto a = assertException(in)) {
    CHECK_ERR(a);
    return Assertion{*a};
  }
  if (auto a = assertAction(in)) {
    CHECK_ERR(a);
    return Assertion{*a};
  }
  if (auto a = assertModule(in)) {
    CHECK_ERR(a);
    return Assertion{*a};
  }
  if (auto a = assertTrap(in)) {
    CHECK_ERR(a);
    return *a;
  }
  return {};
}